

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  int iVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  ulong uVar24;
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  byte bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  ulong uVar80;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar89;
  undefined1 auVar95 [16];
  Geometry *pGVar81;
  RayQueryContext *pRVar82;
  long lVar83;
  uint uVar84;
  long lVar85;
  byte bVar86;
  ulong uVar87;
  float fVar88;
  float fVar137;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar94 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar144;
  undefined4 uVar145;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined8 uVar157;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar177;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_53c;
  RayQueryContext *local_538;
  ulong local_530;
  ulong local_528;
  Primitive *local_520;
  Precalculations *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar77 = (ulong)(byte)PVar13;
  lVar27 = uVar77 * 0x25;
  fVar164 = *(float *)(prim + lVar27 + 0x12);
  auVar146 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar27 + 6));
  fVar163 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar178 = fVar164 * auVar146._0_4_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar91);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar90);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar111 = vpmovsxbd_avx2(auVar95);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar77 * 0xf + 6);
  auVar110 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar100 = vpmovsxbd_avx2(auVar8);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar104 = vcvtdq2ps_avx(auVar100);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar77 + 6);
  auVar105 = vpmovsxbd_avx2(auVar9);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar77 * 0x1a + 6);
  auVar106 = vpmovsxbd_avx2(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar77 * 0x1b + 6);
  auVar109 = vpmovsxbd_avx2(auVar11);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar77 * 0x1c + 6);
  auVar107 = vpmovsxbd_avx2(auVar12);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar196._4_4_ = fVar163;
  auVar196._0_4_ = fVar163;
  auVar196._8_4_ = fVar163;
  auVar196._12_4_ = fVar163;
  auVar196._16_4_ = fVar163;
  auVar196._20_4_ = fVar163;
  auVar196._24_4_ = fVar163;
  auVar196._28_4_ = fVar163;
  auVar96 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar218 = ZEXT3264(auVar96);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar216 = ZEXT3264(auVar97);
  auVar101 = ZEXT1632(CONCAT412(fVar164 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar164 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar164 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar163))));
  auVar98 = vpermps_avx512vl(auVar96,auVar101);
  auVar99 = vpermps_avx512vl(auVar97,auVar101);
  fVar144 = auVar99._0_4_;
  auVar173._0_4_ = fVar144 * auVar111._0_4_;
  fVar154 = auVar99._4_4_;
  auVar173._4_4_ = fVar154 * auVar111._4_4_;
  fVar155 = auVar99._8_4_;
  auVar173._8_4_ = fVar155 * auVar111._8_4_;
  fVar156 = auVar99._12_4_;
  auVar173._12_4_ = fVar156 * auVar111._12_4_;
  fVar177 = auVar99._16_4_;
  auVar173._16_4_ = fVar177 * auVar111._16_4_;
  fVar88 = auVar99._20_4_;
  auVar173._20_4_ = fVar88 * auVar111._20_4_;
  fVar89 = auVar99._24_4_;
  auVar173._24_4_ = fVar89 * auVar111._24_4_;
  auVar173._28_4_ = 0;
  auVar101._4_4_ = auVar105._4_4_ * fVar154;
  auVar101._0_4_ = auVar105._0_4_ * fVar144;
  auVar101._8_4_ = auVar105._8_4_ * fVar155;
  auVar101._12_4_ = auVar105._12_4_ * fVar156;
  auVar101._16_4_ = auVar105._16_4_ * fVar177;
  auVar101._20_4_ = auVar105._20_4_ * fVar88;
  auVar101._24_4_ = auVar105._24_4_ * fVar89;
  auVar101._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar107._4_4_ * fVar154;
  auVar100._0_4_ = auVar107._0_4_ * fVar144;
  auVar100._8_4_ = auVar107._8_4_ * fVar155;
  auVar100._12_4_ = auVar107._12_4_ * fVar156;
  auVar100._16_4_ = auVar107._16_4_ * fVar177;
  auVar100._20_4_ = auVar107._20_4_ * fVar88;
  auVar100._24_4_ = auVar107._24_4_ * fVar89;
  auVar100._28_4_ = auVar99._28_4_;
  auVar91 = vfmadd231ps_fma(auVar173,auVar98,auVar102);
  auVar90 = vfmadd231ps_fma(auVar101,auVar98,auVar104);
  auVar95 = vfmadd231ps_fma(auVar100,auVar109,auVar98);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar196,auVar103);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar196,auVar110);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,auVar196);
  auVar212._4_4_ = fVar178;
  auVar212._0_4_ = fVar178;
  auVar212._8_4_ = fVar178;
  auVar212._12_4_ = fVar178;
  auVar212._16_4_ = fVar178;
  auVar212._20_4_ = fVar178;
  auVar212._24_4_ = fVar178;
  auVar212._28_4_ = fVar178;
  auVar101 = ZEXT1632(CONCAT412(fVar164 * auVar146._12_4_,
                                CONCAT48(fVar164 * auVar146._8_4_,
                                         CONCAT44(fVar164 * auVar146._4_4_,fVar178))));
  auVar100 = vpermps_avx512vl(auVar96,auVar101);
  auVar101 = vpermps_avx512vl(auVar97,auVar101);
  fVar164 = auVar101._0_4_;
  fVar144 = auVar101._4_4_;
  auVar96._4_4_ = fVar144 * auVar111._4_4_;
  auVar96._0_4_ = fVar164 * auVar111._0_4_;
  fVar154 = auVar101._8_4_;
  auVar96._8_4_ = fVar154 * auVar111._8_4_;
  fVar155 = auVar101._12_4_;
  auVar96._12_4_ = fVar155 * auVar111._12_4_;
  fVar156 = auVar101._16_4_;
  auVar96._16_4_ = fVar156 * auVar111._16_4_;
  fVar177 = auVar101._20_4_;
  auVar96._20_4_ = fVar177 * auVar111._20_4_;
  fVar88 = auVar101._24_4_;
  auVar96._24_4_ = fVar88 * auVar111._24_4_;
  auVar96._28_4_ = fVar163;
  auVar97._4_4_ = auVar105._4_4_ * fVar144;
  auVar97._0_4_ = auVar105._0_4_ * fVar164;
  auVar97._8_4_ = auVar105._8_4_ * fVar154;
  auVar97._12_4_ = auVar105._12_4_ * fVar155;
  auVar97._16_4_ = auVar105._16_4_ * fVar156;
  auVar97._20_4_ = auVar105._20_4_ * fVar177;
  auVar97._24_4_ = auVar105._24_4_ * fVar88;
  auVar97._28_4_ = auVar111._28_4_;
  auVar105._4_4_ = auVar107._4_4_ * fVar144;
  auVar105._0_4_ = auVar107._0_4_ * fVar164;
  auVar105._8_4_ = auVar107._8_4_ * fVar154;
  auVar105._12_4_ = auVar107._12_4_ * fVar155;
  auVar105._16_4_ = auVar107._16_4_ * fVar156;
  auVar105._20_4_ = auVar107._20_4_ * fVar177;
  auVar105._24_4_ = auVar107._24_4_ * fVar88;
  auVar105._28_4_ = auVar101._28_4_;
  auVar7 = vfmadd231ps_fma(auVar96,auVar100,auVar102);
  auVar8 = vfmadd231ps_fma(auVar97,auVar100,auVar104);
  auVar9 = vfmadd231ps_fma(auVar105,auVar100,auVar109);
  auVar146 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar212,auVar103);
  auVar158 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar212,auVar110);
  auVar204._8_4_ = 0x7fffffff;
  auVar204._0_8_ = 0x7fffffff7fffffff;
  auVar204._12_4_ = 0x7fffffff;
  auVar204._16_4_ = 0x7fffffff;
  auVar204._20_4_ = 0x7fffffff;
  auVar204._24_4_ = 0x7fffffff;
  auVar204._28_4_ = 0x7fffffff;
  auVar159 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar212,auVar106);
  auVar103 = vandps_avx(auVar204,ZEXT1632(auVar91));
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar200._16_4_ = 0x219392ef;
  auVar200._20_4_ = 0x219392ef;
  auVar200._24_4_ = 0x219392ef;
  auVar200._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar103,auVar200,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar98._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(auVar204,ZEXT1632(auVar90));
  uVar80 = vcmpps_avx512vl(auVar103,auVar200,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar99._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar90._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar90._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar90._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar90._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(auVar204,ZEXT1632(auVar95));
  uVar80 = vcmpps_avx512vl(auVar103,auVar200,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar103._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar95._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar95._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar95._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar95._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar98);
  auVar201._8_4_ = 0x3f800000;
  auVar201._0_8_ = 0x3f8000003f800000;
  auVar201._12_4_ = 0x3f800000;
  auVar201._16_4_ = 0x3f800000;
  auVar201._20_4_ = 0x3f800000;
  auVar201._24_4_ = 0x3f800000;
  auVar201._28_4_ = 0x3f800000;
  auVar91 = vfnmadd213ps_fma(auVar98,auVar102,auVar201);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar99);
  auVar90 = vfnmadd213ps_fma(auVar99,auVar102,auVar201);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar103);
  auVar95 = vfnmadd213ps_fma(auVar103,auVar102,auVar201);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar102,auVar102);
  fVar164 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar199._4_4_ = fVar164;
  auVar199._0_4_ = fVar164;
  auVar199._8_4_ = fVar164;
  auVar199._12_4_ = fVar164;
  auVar199._16_4_ = fVar164;
  auVar199._20_4_ = fVar164;
  auVar199._24_4_ = fVar164;
  auVar199._28_4_ = fVar164;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0xb + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar7 = vfmadd213ps_fma(auVar102,auVar199,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar111);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0xd + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar8 = vfmadd213ps_fma(auVar102,auVar199,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x12 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar80 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 2 + uVar80 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar9 = vfmadd213ps_fma(auVar102,auVar199,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x18 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar10 = vfmadd213ps_fma(auVar102,auVar199,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x1d + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 + (ulong)(byte)PVar13 * 0x20 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar11 = vfmadd213ps_fma(auVar102,auVar199,auVar103);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar13 * 0x20 - uVar77) + 6)
                           );
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x23 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,auVar103);
  auVar12 = vfmadd213ps_fma(auVar102,auVar199,auVar103);
  auVar103 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar146));
  auVar106._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar106._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar106._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar106._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar106._16_4_ = auVar103._16_4_ * 0.0;
  auVar106._20_4_ = auVar103._20_4_ * 0.0;
  auVar106._24_4_ = auVar103._24_4_ * 0.0;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar146));
  auVar174._0_4_ = auVar91._0_4_ * auVar103._0_4_;
  auVar174._4_4_ = auVar91._4_4_ * auVar103._4_4_;
  auVar174._8_4_ = auVar91._8_4_ * auVar103._8_4_;
  auVar174._12_4_ = auVar91._12_4_ * auVar103._12_4_;
  auVar174._16_4_ = auVar103._16_4_ * 0.0;
  auVar174._20_4_ = auVar103._20_4_ * 0.0;
  auVar174._24_4_ = auVar103._24_4_ * 0.0;
  auVar174._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar158));
  auVar109._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar109._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar109._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar109._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar109._16_4_ = auVar103._16_4_ * 0.0;
  auVar109._20_4_ = auVar103._20_4_ * 0.0;
  auVar109._24_4_ = auVar103._24_4_ * 0.0;
  auVar109._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar158));
  auVar161._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar161._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar161._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar161._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar161._16_4_ = auVar103._16_4_ * 0.0;
  auVar161._20_4_ = auVar103._20_4_ * 0.0;
  auVar161._24_4_ = auVar103._24_4_ * 0.0;
  auVar161._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar159));
  auVar107._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar159));
  auVar108._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar108._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar108._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar106,auVar174);
  auVar102 = vpminsd_avx2(auVar109,auVar161);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102 = vpminsd_avx2(auVar107,auVar108);
  uVar145 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar111._4_4_ = uVar145;
  auVar111._0_4_ = uVar145;
  auVar111._8_4_ = uVar145;
  auVar111._12_4_ = uVar145;
  auVar111._16_4_ = uVar145;
  auVar111._20_4_ = uVar145;
  auVar111._24_4_ = uVar145;
  auVar111._28_4_ = uVar145;
  auVar102 = vmaxps_avx512vl(auVar102,auVar111);
  auVar103 = vmaxps_avx(auVar103,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar103,auVar102);
  auVar103 = vpmaxsd_avx2(auVar106,auVar174);
  auVar102 = vpmaxsd_avx2(auVar109,auVar161);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar102 = vpmaxsd_avx2(auVar107,auVar108);
  fVar164 = (ray->super_RayK<1>).tfar;
  auVar110._4_4_ = fVar164;
  auVar110._0_4_ = fVar164;
  auVar110._8_4_ = fVar164;
  auVar110._12_4_ = fVar164;
  auVar110._16_4_ = fVar164;
  auVar110._20_4_ = fVar164;
  auVar110._24_4_ = fVar164;
  auVar110._28_4_ = fVar164;
  auVar102 = vminps_avx512vl(auVar102,auVar110);
  auVar103 = vminps_avx(auVar103,auVar102);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar104);
  local_518 = pre;
  auVar102 = vpbroadcastd_avx512vl();
  uVar25 = vpcmpgtd_avx512vl(auVar102,_DAT_01fe9900);
  uVar157 = vcmpps_avx512vl(local_80,auVar103,2);
  if ((byte)((byte)uVar157 & (byte)uVar25) != 0) {
    uVar80 = (ulong)(byte)((byte)uVar157 & (byte)uVar25);
    auVar217 = ZEXT464(0xbf800000);
    local_520 = prim;
    local_538 = context;
    do {
      lVar27 = 0;
      for (uVar77 = uVar80; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar84 = *(uint *)(prim + 2);
      uVar79 = *(uint *)(prim + lVar27 * 4 + 6);
      local_530 = (ulong)uVar84;
      pGVar81 = (context->scene->geometries).items[uVar84].ptr;
      local_528 = (ulong)uVar79;
      uVar77 = (ulong)*(uint *)(*(long *)&pGVar81->field_0x58 +
                               (ulong)uVar79 *
                               pGVar81[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar164 = (pGVar81->time_range).lower;
      fVar164 = pGVar81->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar164) /
                ((pGVar81->time_range).upper - fVar164));
      auVar91 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
      auVar90 = vaddss_avx512f(ZEXT416((uint)pGVar81->fnumTimeSegments),auVar217._0_16_);
      auVar91 = vminss_avx(auVar91,auVar90);
      auVar91 = vmaxss_avx(ZEXT816(0) << 0x20,auVar91);
      fVar164 = fVar164 - auVar91._0_4_;
      _Var15 = pGVar81[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar85 = (long)(int)auVar91._0_4_ * 0x38;
      lVar27 = *(long *)(_Var15 + 0x10 + lVar85);
      lVar83 = *(long *)(_Var15 + 0x38 + lVar85);
      lVar16 = *(long *)(_Var15 + 0x48 + lVar85);
      auVar158._4_4_ = fVar164;
      auVar158._0_4_ = fVar164;
      auVar158._8_4_ = fVar164;
      auVar158._12_4_ = fVar164;
      pfVar3 = (float *)(lVar83 + uVar77 * lVar16);
      auVar94._0_4_ = fVar164 * *pfVar3;
      auVar94._4_4_ = fVar164 * pfVar3[1];
      auVar94._8_4_ = fVar164 * pfVar3[2];
      auVar94._12_4_ = fVar164 * pfVar3[3];
      pfVar3 = (float *)(lVar83 + (uVar77 + 1) * lVar16);
      auVar206._0_4_ = fVar164 * *pfVar3;
      auVar206._4_4_ = fVar164 * pfVar3[1];
      auVar206._8_4_ = fVar164 * pfVar3[2];
      auVar206._12_4_ = fVar164 * pfVar3[3];
      auVar91 = vmulps_avx512vl(auVar158,*(undefined1 (*) [16])(lVar83 + (uVar77 + 2) * lVar16));
      auVar90 = vmulps_avx512vl(auVar158,*(undefined1 (*) [16])(lVar83 + lVar16 * (uVar77 + 3)));
      lVar83 = *(long *)(_Var15 + lVar85);
      fVar164 = 1.0 - fVar164;
      auVar146._4_4_ = fVar164;
      auVar146._0_4_ = fVar164;
      auVar146._8_4_ = fVar164;
      auVar146._12_4_ = fVar164;
      local_4b0 = vfmadd231ps_fma(auVar94,auVar146,*(undefined1 (*) [16])(lVar83 + lVar27 * uVar77))
      ;
      local_4c0 = vfmadd231ps_fma(auVar206,auVar146,
                                  *(undefined1 (*) [16])(lVar83 + lVar27 * (uVar77 + 1)));
      local_4d0 = vfmadd231ps_avx512vl
                            (auVar91,auVar146,*(undefined1 (*) [16])(lVar83 + lVar27 * (uVar77 + 2))
                            );
      _local_4e0 = vfmadd231ps_avx512vl
                             (auVar90,auVar146,
                              *(undefined1 (*) [16])(lVar83 + lVar27 * (uVar77 + 3)));
      iVar14 = (int)pGVar81[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar27 = (long)iVar14 * 0x44;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar90 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
      uVar145 = auVar90._0_4_;
      auVar159._4_4_ = uVar145;
      auVar159._0_4_ = uVar145;
      auVar159._8_4_ = uVar145;
      auVar159._12_4_ = uVar145;
      auVar91 = vshufps_avx(auVar90,auVar90,0x55);
      aVar5 = (local_518->ray_space).vx.field_0;
      aVar6 = (local_518->ray_space).vy.field_0;
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      fVar164 = (local_518->ray_space).vz.field_0.m128[0];
      fVar144 = (local_518->ray_space).vz.field_0.m128[1];
      fVar154 = (local_518->ray_space).vz.field_0.m128[2];
      fVar155 = (local_518->ray_space).vz.field_0.m128[3];
      auVar209._0_4_ = auVar90._0_4_ * fVar164;
      auVar209._4_4_ = auVar90._4_4_ * fVar144;
      auVar209._8_4_ = auVar90._8_4_ * fVar154;
      auVar209._12_4_ = auVar90._12_4_ * fVar155;
      auVar91 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar6,auVar91);
      auVar95 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar159);
      auVar90 = vsubps_avx(local_4c0,(undefined1  [16])aVar4);
      uVar145 = auVar90._0_4_;
      auVar160._4_4_ = uVar145;
      auVar160._0_4_ = uVar145;
      auVar160._8_4_ = uVar145;
      auVar160._12_4_ = uVar145;
      auVar91 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar210._0_4_ = auVar90._0_4_ * fVar164;
      auVar210._4_4_ = auVar90._4_4_ * fVar144;
      auVar210._8_4_ = auVar90._8_4_ * fVar154;
      auVar210._12_4_ = auVar90._12_4_ * fVar155;
      auVar91 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar91);
      auVar7 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar160);
      auVar90 = vsubps_avx512vl(local_4d0,(undefined1  [16])aVar4);
      uVar145 = auVar90._0_4_;
      auVar92._4_4_ = uVar145;
      auVar92._0_4_ = uVar145;
      auVar92._8_4_ = uVar145;
      auVar92._12_4_ = uVar145;
      auVar91 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar211._0_4_ = auVar90._0_4_ * fVar164;
      auVar211._4_4_ = auVar90._4_4_ * fVar144;
      auVar211._8_4_ = auVar90._8_4_ * fVar154;
      auVar211._12_4_ = auVar90._12_4_ * fVar155;
      auVar91 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar91);
      auVar8 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar92);
      local_3e0 = ZEXT1632((undefined1  [16])aVar4);
      auVar90 = vsubps_avx512vl(_local_4e0,(undefined1  [16])aVar4);
      uVar145 = auVar90._0_4_;
      auVar93._4_4_ = uVar145;
      auVar93._0_4_ = uVar145;
      auVar93._8_4_ = uVar145;
      auVar93._12_4_ = uVar145;
      auVar91 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar213._0_4_ = auVar90._0_4_ * fVar164;
      auVar213._4_4_ = auVar90._4_4_ * fVar144;
      auVar213._8_4_ = auVar90._8_4_ * fVar154;
      auVar213._12_4_ = auVar90._12_4_ * fVar155;
      auVar91 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar6,auVar91);
      auVar9 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar93);
      auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar27);
      uVar145 = auVar95._0_4_;
      local_2e0._4_4_ = uVar145;
      local_2e0._0_4_ = uVar145;
      local_2e0._8_4_ = uVar145;
      local_2e0._12_4_ = uVar145;
      local_2e0._16_4_ = uVar145;
      local_2e0._20_4_ = uVar145;
      local_2e0._24_4_ = uVar145;
      local_2e0._28_4_ = uVar145;
      auVar161 = auVar218._0_32_;
      local_300 = vpermps_avx512vl(auVar161,ZEXT1632(auVar95));
      auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x484);
      uVar145 = auVar7._0_4_;
      auVar179._4_4_ = uVar145;
      auVar179._0_4_ = uVar145;
      auVar179._8_4_ = uVar145;
      auVar179._12_4_ = uVar145;
      local_320._16_4_ = uVar145;
      local_320._0_16_ = auVar179;
      local_320._20_4_ = uVar145;
      local_320._24_4_ = uVar145;
      local_320._28_4_ = uVar145;
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x908);
      local_340 = vpermps_avx512vl(auVar161,ZEXT1632(auVar7));
      local_360 = vbroadcastss_avx512vl(auVar8);
      local_380 = vpermps_avx512vl(auVar161,ZEXT1632(auVar8));
      auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0xd8c);
      uVar145 = auVar9._0_4_;
      local_3a0._4_4_ = uVar145;
      local_3a0._0_4_ = uVar145;
      fStack_398 = (float)uVar145;
      fStack_394 = (float)uVar145;
      fStack_390 = (float)uVar145;
      fStack_38c = (float)uVar145;
      fStack_388 = (float)uVar145;
      register0x0000139c = uVar145;
      _local_3c0 = vpermps_avx512vl(auVar161,ZEXT1632(auVar9));
      auVar104 = vmulps_avx512vl(_local_3a0,auVar110);
      auVar105 = vmulps_avx512vl(_local_3c0,auVar110);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_360);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,local_380);
      auVar91 = vfmadd231ps_fma(auVar104,auVar102,local_320);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar102,local_340);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar103,local_2e0);
      auVar197 = ZEXT3264(auVar107);
      auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar27);
      auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x484);
      auVar100 = vfmadd231ps_avx512vl(auVar106,auVar103,local_300);
      auVar195 = ZEXT3264(auVar100);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x908);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0xd8c);
      auVar101 = vmulps_avx512vl(_local_3a0,auVar109);
      auVar96 = vmulps_avx512vl(_local_3c0,auVar109);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_360);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar106,local_380);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_320);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_340);
      auVar10 = vfmadd231ps_fma(auVar101,auVar104,local_2e0);
      auVar202 = ZEXT1664(auVar10);
      auVar11 = vfmadd231ps_fma(auVar96,auVar104,local_300);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar10),auVar107);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar11),auVar100);
      auVar97 = vmulps_avx512vl(auVar100,auVar101);
      auVar98 = vmulps_avx512vl(auVar107,auVar96);
      auVar97 = vsubps_avx512vl(auVar97,auVar98);
      auVar91 = vshufps_avx(local_4b0,local_4b0,0xff);
      uVar157 = auVar91._0_8_;
      local_a0._8_8_ = uVar157;
      local_a0._0_8_ = uVar157;
      local_a0._16_8_ = uVar157;
      local_a0._24_8_ = uVar157;
      auVar91 = vshufps_avx(local_4c0,local_4c0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar91);
      auVar91 = vshufps_avx512vl(local_4d0,local_4d0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar91);
      auVar91 = vshufps_avx512vl(_local_4e0,_local_4e0,0xff);
      uVar157 = auVar91._0_8_;
      local_100._8_8_ = uVar157;
      local_100._0_8_ = uVar157;
      local_100._16_8_ = uVar157;
      local_100._24_8_ = uVar157;
      auVar98 = vmulps_avx512vl(local_100,auVar110);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_a0);
      auVar99 = vmulps_avx512vl(local_100,auVar109);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_c0);
      auVar12 = vfmadd231ps_fma(auVar99,auVar104,local_a0);
      auVar99 = vmulps_avx512vl(auVar96,auVar96);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar101);
      auVar108 = vmaxps_avx512vl(auVar98,ZEXT1632(auVar12));
      auVar108 = vmulps_avx512vl(auVar108,auVar108);
      auVar99 = vmulps_avx512vl(auVar108,auVar99);
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      uVar157 = vcmpps_avx512vl(auVar97,auVar99,2);
      auVar160 = local_4b0;
      auVar91 = vblendps_avx(auVar95,local_4b0,8);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar90 = vandps_avx512vl(auVar91,auVar92);
      auVar159 = local_4c0;
      auVar91 = vblendps_avx(auVar7,local_4c0,8);
      auVar91 = vandps_avx512vl(auVar91,auVar92);
      auVar90 = vmaxps_avx(auVar90,auVar91);
      auVar158 = local_4d0;
      auVar91 = vblendps_avx(auVar8,local_4d0,8);
      auVar93 = vandps_avx512vl(auVar91,auVar92);
      auVar146 = _local_4e0;
      auVar91 = vblendps_avx(auVar9,_local_4e0,8);
      auVar91 = vandps_avx512vl(auVar91,auVar92);
      auVar91 = vmaxps_avx(auVar93,auVar91);
      auVar91 = vmaxps_avx(auVar90,auVar91);
      auVar90 = vmovshdup_avx(auVar91);
      auVar90 = vmaxss_avx(auVar90,auVar91);
      auVar91 = vshufpd_avx(auVar91,auVar91,1);
      auVar91 = vmaxss_avx(auVar91,auVar90);
      auVar90 = vcvtsi2ss_avx512f(local_4d0,iVar14);
      local_460._0_16_ = auVar90;
      auVar205._0_4_ = auVar90._0_4_;
      auVar205._4_4_ = auVar205._0_4_;
      auVar205._8_4_ = auVar205._0_4_;
      auVar205._12_4_ = auVar205._0_4_;
      auVar205._16_4_ = auVar205._0_4_;
      auVar205._20_4_ = auVar205._0_4_;
      auVar205._24_4_ = auVar205._0_4_;
      auVar205._28_4_ = auVar205._0_4_;
      uVar25 = vcmpps_avx512vl(auVar205,_DAT_01faff40,0xe);
      bVar86 = (byte)uVar157 & (byte)uVar25;
      fVar164 = auVar91._0_4_ * 4.7683716e-07;
      local_440._0_16_ = ZEXT416((uint)fVar164);
      auVar97 = auVar216._0_32_;
      local_140 = vpermps_avx512vl(auVar97,ZEXT1632(auVar95));
      local_160 = vpermps_avx512vl(auVar97,ZEXT1632(auVar7));
      local_180 = vpermps_avx512vl(auVar97,ZEXT1632(auVar8));
      local_1a0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar9));
      _local_4e0 = auVar146;
      local_4d0 = auVar158;
      local_4c0 = auVar159;
      local_4b0 = auVar160;
      if (bVar86 != 0) {
        auVar109 = vmulps_avx512vl(local_1a0,auVar109);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_180,auVar109);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar106);
        auVar105 = vfmadd213ps_avx512vl(auVar104,local_140,auVar105);
        auVar110 = vmulps_avx512vl(local_1a0,auVar110);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar110);
        auVar106 = vfmadd213ps_avx512vl(auVar102,local_160,auVar111);
        auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1694);
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar27 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar103,local_140,auVar106);
        auVar103 = vmulps_avx512vl(_local_3a0,auVar104);
        auVar109 = vmulps_avx512vl(_local_3c0,auVar104);
        auVar104 = vmulps_avx512vl(local_1a0,auVar104);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_360);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar110,local_380);
        auVar110 = vfmadd231ps_avx512vl(auVar104,local_180,auVar110);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar111,local_320);
        auVar104 = vfmadd231ps_avx512vl(auVar109,auVar111,local_340);
        auVar109 = vfmadd231ps_avx512vl(auVar110,local_160,auVar111);
        auVar91 = vfmadd231ps_fma(auVar103,auVar102,local_2e0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_300);
        auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1f9c);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_140,auVar102);
        auVar102 = vmulps_avx512vl(_local_3a0,auVar110);
        auVar97 = vmulps_avx512vl(_local_3c0,auVar110);
        auVar110 = vmulps_avx512vl(local_1a0,auVar110);
        auVar99 = vfmadd231ps_avx512vl(auVar102,auVar111,local_360);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar111,local_380);
        auVar111 = vfmadd231ps_avx512vl(auVar110,local_180,auVar111);
        auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar27 + 0x1694);
        auVar110 = vfmadd231ps_avx512vl(auVar99,auVar102,local_320);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_340);
        auVar102 = vfmadd231ps_avx512vl(auVar111,local_160,auVar102);
        auVar90 = vfmadd231ps_fma(auVar110,auVar103,local_2e0);
        auVar111 = vfmadd231ps_avx512vl(auVar97,auVar103,local_300);
        auVar110 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
        auVar217 = ZEXT1664(auVar217._0_16_);
        auVar218 = ZEXT3264(auVar161);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar216 = ZEXT3264(auVar103);
        auVar214._8_4_ = 0x7fffffff;
        auVar214._0_8_ = 0x7fffffff7fffffff;
        auVar214._12_4_ = 0x7fffffff;
        auVar214._16_4_ = 0x7fffffff;
        auVar214._20_4_ = 0x7fffffff;
        auVar214._24_4_ = 0x7fffffff;
        auVar214._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(ZEXT1632(auVar91),auVar214);
        auVar102 = vandps_avx(auVar104,auVar214);
        auVar102 = vmaxps_avx(auVar103,auVar102);
        auVar103 = vandps_avx(auVar109,auVar214);
        auVar103 = vmaxps_avx(auVar102,auVar103);
        auVar207._4_4_ = fVar164;
        auVar207._0_4_ = fVar164;
        auVar207._8_4_ = fVar164;
        auVar207._12_4_ = fVar164;
        auVar207._16_4_ = fVar164;
        auVar207._20_4_ = fVar164;
        auVar207._24_4_ = fVar164;
        auVar207._28_4_ = fVar164;
        uVar77 = vcmpps_avx512vl(auVar103,auVar207,1);
        bVar18 = (bool)((byte)uVar77 & 1);
        auVar112._0_4_ = (float)((uint)bVar18 * auVar101._0_4_ | (uint)!bVar18 * auVar91._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar91._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar91._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar91._12_4_);
        fVar144 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar101._16_4_);
        auVar112._16_4_ = fVar144;
        fVar164 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar101._20_4_);
        auVar112._20_4_ = fVar164;
        fVar154 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar101._24_4_);
        auVar112._24_4_ = fVar154;
        auVar112._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar101._28_4_;
        bVar18 = (bool)((byte)uVar77 & 1);
        auVar113._0_4_ = (float)((uint)bVar18 * auVar96._0_4_ | (uint)!bVar18 * auVar104._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar104._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar104._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar104._12_4_);
        bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar18 * auVar96._16_4_ | (uint)!bVar18 * auVar104._16_4_);
        bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar18 * auVar96._20_4_ | (uint)!bVar18 * auVar104._20_4_);
        bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar18 * auVar96._24_4_ | (uint)!bVar18 * auVar104._24_4_);
        bVar18 = SUB81(uVar77 >> 7,0);
        auVar113._28_4_ = (uint)bVar18 * auVar96._28_4_ | (uint)!bVar18 * auVar104._28_4_;
        auVar103 = vandps_avx(auVar214,ZEXT1632(auVar90));
        auVar102 = vandps_avx(auVar111,auVar214);
        auVar102 = vmaxps_avx(auVar103,auVar102);
        auVar103 = vandps_avx(auVar110,auVar214);
        auVar103 = vmaxps_avx(auVar102,auVar103);
        uVar77 = vcmpps_avx512vl(auVar103,auVar207,1);
        bVar18 = (bool)((byte)uVar77 & 1);
        auVar114._0_4_ = (float)((uint)bVar18 * auVar101._0_4_ | (uint)!bVar18 * auVar90._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar90._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar90._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar90._12_4_);
        fVar155 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar101._16_4_);
        auVar114._16_4_ = fVar155;
        fVar156 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar101._20_4_);
        auVar114._20_4_ = fVar156;
        fVar177 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar101._24_4_);
        auVar114._24_4_ = fVar177;
        uVar78 = (uint)(byte)(uVar77 >> 7) * auVar101._28_4_;
        auVar114._28_4_ = uVar78;
        bVar18 = (bool)((byte)uVar77 & 1);
        auVar115._0_4_ = (float)((uint)bVar18 * auVar96._0_4_ | (uint)!bVar18 * auVar111._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar111._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar111._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar111._12_4_);
        bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar18 * auVar96._16_4_ | (uint)!bVar18 * auVar111._16_4_);
        bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar18 * auVar96._20_4_ | (uint)!bVar18 * auVar111._20_4_);
        bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar18 * auVar96._24_4_ | (uint)!bVar18 * auVar111._24_4_);
        bVar18 = SUB81(uVar77 >> 7,0);
        auVar115._28_4_ = (uint)bVar18 * auVar96._28_4_ | (uint)!bVar18 * auVar111._28_4_;
        auVar94 = vxorps_avx512vl(auVar179,auVar179);
        auVar103 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar94));
        auVar91 = vfmadd231ps_fma(auVar103,auVar113,auVar113);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar88 = auVar103._0_4_;
        fVar89 = auVar103._4_4_;
        fVar163 = auVar103._8_4_;
        fVar178 = auVar103._12_4_;
        fVar137 = auVar103._16_4_;
        fVar138 = auVar103._20_4_;
        fVar140 = auVar103._24_4_;
        auVar43._4_4_ = fVar89 * fVar89 * fVar89 * auVar91._4_4_ * -0.5;
        auVar43._0_4_ = fVar88 * fVar88 * fVar88 * auVar91._0_4_ * -0.5;
        auVar43._8_4_ = fVar163 * fVar163 * fVar163 * auVar91._8_4_ * -0.5;
        auVar43._12_4_ = fVar178 * fVar178 * fVar178 * auVar91._12_4_ * -0.5;
        auVar43._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar43._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar43._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar43._28_4_ = auVar110._28_4_;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar103 = vfmadd231ps_avx512vl(auVar43,auVar102,auVar103);
        auVar44._4_4_ = auVar113._4_4_ * auVar103._4_4_;
        auVar44._0_4_ = auVar113._0_4_ * auVar103._0_4_;
        auVar44._8_4_ = auVar113._8_4_ * auVar103._8_4_;
        auVar44._12_4_ = auVar113._12_4_ * auVar103._12_4_;
        auVar44._16_4_ = auVar113._16_4_ * auVar103._16_4_;
        auVar44._20_4_ = auVar113._20_4_ * auVar103._20_4_;
        auVar44._24_4_ = auVar113._24_4_ * auVar103._24_4_;
        auVar44._28_4_ = 0;
        auVar45._4_4_ = auVar103._4_4_ * -auVar112._4_4_;
        auVar45._0_4_ = auVar103._0_4_ * -auVar112._0_4_;
        auVar45._8_4_ = auVar103._8_4_ * -auVar112._8_4_;
        auVar45._12_4_ = auVar103._12_4_ * -auVar112._12_4_;
        auVar45._16_4_ = auVar103._16_4_ * -fVar144;
        auVar45._20_4_ = auVar103._20_4_ * -fVar164;
        auVar45._24_4_ = auVar103._24_4_ * -fVar154;
        auVar45._28_4_ = auVar113._28_4_;
        auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar94));
        auVar101 = ZEXT1632(auVar94);
        auVar111 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar101);
        auVar91 = vfmadd231ps_fma(auVar111,auVar115,auVar115);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar164 = auVar111._0_4_;
        fVar144 = auVar111._4_4_;
        fVar154 = auVar111._8_4_;
        fVar88 = auVar111._12_4_;
        fVar89 = auVar111._16_4_;
        fVar163 = auVar111._20_4_;
        fVar178 = auVar111._24_4_;
        auVar46._4_4_ = fVar144 * fVar144 * fVar144 * auVar91._4_4_ * -0.5;
        auVar46._0_4_ = fVar164 * fVar164 * fVar164 * auVar91._0_4_ * -0.5;
        auVar46._8_4_ = fVar154 * fVar154 * fVar154 * auVar91._8_4_ * -0.5;
        auVar46._12_4_ = fVar88 * fVar88 * fVar88 * auVar91._12_4_ * -0.5;
        auVar46._16_4_ = fVar89 * fVar89 * fVar89 * -0.0;
        auVar46._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar46._24_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar46._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar46,auVar102,auVar111);
        auVar47._4_4_ = auVar115._4_4_ * auVar102._4_4_;
        auVar47._0_4_ = auVar115._0_4_ * auVar102._0_4_;
        auVar47._8_4_ = auVar115._8_4_ * auVar102._8_4_;
        auVar47._12_4_ = auVar115._12_4_ * auVar102._12_4_;
        auVar47._16_4_ = auVar115._16_4_ * auVar102._16_4_;
        auVar47._20_4_ = auVar115._20_4_ * auVar102._20_4_;
        auVar47._24_4_ = auVar115._24_4_ * auVar102._24_4_;
        auVar47._28_4_ = auVar111._28_4_;
        auVar48._4_4_ = -auVar114._4_4_ * auVar102._4_4_;
        auVar48._0_4_ = -auVar114._0_4_ * auVar102._0_4_;
        auVar48._8_4_ = -auVar114._8_4_ * auVar102._8_4_;
        auVar48._12_4_ = -auVar114._12_4_ * auVar102._12_4_;
        auVar48._16_4_ = -fVar155 * auVar102._16_4_;
        auVar48._20_4_ = -fVar156 * auVar102._20_4_;
        auVar48._24_4_ = -fVar177 * auVar102._24_4_;
        auVar48._28_4_ = uVar78 ^ 0x80000000;
        auVar102 = vmulps_avx512vl(auVar102,auVar101);
        auVar91 = vfmadd213ps_fma(auVar44,auVar98,auVar107);
        auVar90 = vfmadd213ps_fma(auVar45,auVar98,auVar100);
        auVar111 = vfmadd213ps_avx512vl(auVar103,auVar98,auVar106);
        auVar110 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar12),ZEXT1632(auVar10));
        auVar92 = vfnmadd213ps_fma(auVar44,auVar98,auVar107);
        auVar109 = ZEXT1632(auVar12);
        auVar95 = vfmadd213ps_fma(auVar48,auVar109,ZEXT1632(auVar11));
        auVar93 = vfnmadd213ps_fma(auVar45,auVar98,auVar100);
        auVar7 = vfmadd213ps_fma(auVar102,auVar109,auVar105);
        auVar104 = vfnmadd231ps_avx512vl(auVar106,auVar98,auVar103);
        auVar10 = vfnmadd213ps_fma(auVar47,auVar109,ZEXT1632(auVar10));
        auVar11 = vfnmadd213ps_fma(auVar48,auVar109,ZEXT1632(auVar11));
        auVar179 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar12),auVar102);
        auVar102 = vsubps_avx512vl(auVar110,ZEXT1632(auVar92));
        auVar103 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar93));
        auVar105 = vsubps_avx512vl(ZEXT1632(auVar7),auVar104);
        auVar106 = vmulps_avx512vl(auVar103,auVar104);
        auVar8 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar93),auVar105);
        auVar49._4_4_ = auVar92._4_4_ * auVar105._4_4_;
        auVar49._0_4_ = auVar92._0_4_ * auVar105._0_4_;
        auVar49._8_4_ = auVar92._8_4_ * auVar105._8_4_;
        auVar49._12_4_ = auVar92._12_4_ * auVar105._12_4_;
        auVar49._16_4_ = auVar105._16_4_ * 0.0;
        auVar49._20_4_ = auVar105._20_4_ * 0.0;
        auVar49._24_4_ = auVar105._24_4_ * 0.0;
        auVar49._28_4_ = auVar105._28_4_;
        auVar105 = vfmsub231ps_avx512vl(auVar49,auVar104,auVar102);
        auVar50._4_4_ = auVar93._4_4_ * auVar102._4_4_;
        auVar50._0_4_ = auVar93._0_4_ * auVar102._0_4_;
        auVar50._8_4_ = auVar93._8_4_ * auVar102._8_4_;
        auVar50._12_4_ = auVar93._12_4_ * auVar102._12_4_;
        auVar50._16_4_ = auVar102._16_4_ * 0.0;
        auVar50._20_4_ = auVar102._20_4_ * 0.0;
        auVar50._24_4_ = auVar102._24_4_ * 0.0;
        auVar50._28_4_ = auVar102._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar92),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar101,auVar105);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar101,ZEXT1632(auVar8));
        auVar96 = ZEXT1632(auVar94);
        uVar77 = vcmpps_avx512vl(auVar103,auVar96,2);
        bVar76 = (byte)uVar77;
        fVar88 = (float)((uint)(bVar76 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar10._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar163 = (float)((uint)bVar18 * auVar91._4_4_ | (uint)!bVar18 * auVar10._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar137 = (float)((uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * auVar10._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar140 = (float)((uint)bVar18 * auVar91._12_4_ | (uint)!bVar18 * auVar10._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar163,fVar88))));
        fVar89 = (float)((uint)(bVar76 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar11._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar178 = (float)((uint)bVar18 * auVar90._4_4_ | (uint)!bVar18 * auVar11._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar138 = (float)((uint)bVar18 * auVar90._8_4_ | (uint)!bVar18 * auVar11._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar141 = (float)((uint)bVar18 * auVar90._12_4_ | (uint)!bVar18 * auVar11._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar138,CONCAT44(fVar178,fVar89))));
        auVar116._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar111._0_4_ |
                    (uint)!(bool)(bVar76 & 1) * auVar179._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar179._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar179._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar179._12_4_);
        fVar164 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_);
        auVar116._16_4_ = fVar164;
        fVar144 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_);
        auVar116._20_4_ = fVar144;
        fVar154 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_);
        auVar116._24_4_ = fVar154;
        iVar1 = (uint)(byte)(uVar77 >> 7) * auVar111._28_4_;
        auVar116._28_4_ = iVar1;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar92),auVar110);
        auVar117._0_4_ =
             (uint)(bVar76 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar8._0_4_;
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar8._4_4_;
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar8._8_4_;
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar8._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar102._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar102._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar102._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar95));
        auVar118._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar90._0_4_
                    );
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar90._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar90._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar90._12_4_);
        fVar155 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar102._16_4_);
        auVar118._16_4_ = fVar155;
        fVar177 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar102._20_4_);
        auVar118._20_4_ = fVar177;
        fVar156 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar102._24_4_);
        auVar118._24_4_ = fVar156;
        auVar118._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar7));
        auVar119._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar76 & 1) * auVar111._0_4_);
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar111._4_4_);
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar111._8_4_);
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar111._12_4_);
        bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar18 * auVar102._16_4_ | (uint)!bVar18 * auVar111._16_4_);
        bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar18 * auVar102._20_4_ | (uint)!bVar18 * auVar111._20_4_);
        bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar18 * auVar102._24_4_ | (uint)!bVar18 * auVar111._24_4_);
        bVar18 = SUB81(uVar77 >> 7,0);
        auVar119._28_4_ = (uint)bVar18 * auVar102._28_4_ | (uint)!bVar18 * auVar111._28_4_;
        auVar120._0_4_ =
             (uint)(bVar76 & 1) * (int)auVar92._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar110._0_4_;
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar18 * (int)auVar92._4_4_ | (uint)!bVar18 * auVar110._4_4_;
        bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar18 * (int)auVar92._8_4_ | (uint)!bVar18 * auVar110._8_4_;
        bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar18 * (int)auVar92._12_4_ | (uint)!bVar18 * auVar110._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar110._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar110._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar110._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar110._28_4_;
        bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar121._0_4_ =
             (uint)(bVar76 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar7._0_4_;
        bVar19 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar19 * auVar104._4_4_ | (uint)!bVar19 * auVar7._4_4_;
        bVar19 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar19 * auVar104._8_4_ | (uint)!bVar19 * auVar7._8_4_;
        bVar19 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar19 * auVar104._12_4_ | (uint)!bVar19 * auVar7._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar104._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar104._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar77 >> 7) * auVar104._28_4_;
        auVar121._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar120,auVar106);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar93._12_4_ |
                                                 (uint)!bVar21 * auVar95._12_4_,
                                                 CONCAT48((uint)bVar20 * (int)auVar93._8_4_ |
                                                          (uint)!bVar20 * auVar95._8_4_,
                                                          CONCAT44((uint)bVar18 * (int)auVar93._4_4_
                                                                   | (uint)!bVar18 * auVar95._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar93._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar95._0_4_)))),auVar109);
        auVar197 = ZEXT3264(auVar102);
        auVar111 = vsubps_avx(auVar121,auVar116);
        auVar110 = vsubps_avx(auVar106,auVar117);
        auVar202 = ZEXT3264(auVar110);
        auVar104 = vsubps_avx(auVar109,auVar118);
        auVar105 = vsubps_avx(auVar116,auVar119);
        auVar51._4_4_ = auVar111._4_4_ * fVar163;
        auVar51._0_4_ = auVar111._0_4_ * fVar88;
        auVar51._8_4_ = auVar111._8_4_ * fVar137;
        auVar51._12_4_ = auVar111._12_4_ * fVar140;
        auVar51._16_4_ = auVar111._16_4_ * 0.0;
        auVar51._20_4_ = auVar111._20_4_ * 0.0;
        auVar51._24_4_ = auVar111._24_4_ * 0.0;
        auVar51._28_4_ = iVar2;
        auVar91 = vfmsub231ps_fma(auVar51,auVar116,auVar107);
        auVar52._4_4_ = fVar178 * auVar107._4_4_;
        auVar52._0_4_ = fVar89 * auVar107._0_4_;
        auVar52._8_4_ = fVar138 * auVar107._8_4_;
        auVar52._12_4_ = fVar141 * auVar107._12_4_;
        auVar52._16_4_ = auVar107._16_4_ * 0.0;
        auVar52._20_4_ = auVar107._20_4_ * 0.0;
        auVar52._24_4_ = auVar107._24_4_ * 0.0;
        auVar52._28_4_ = auVar103._28_4_;
        auVar90 = vfmsub231ps_fma(auVar52,auVar106,auVar102);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar96,ZEXT1632(auVar91));
        auVar191._0_4_ = auVar102._0_4_ * auVar116._0_4_;
        auVar191._4_4_ = auVar102._4_4_ * auVar116._4_4_;
        auVar191._8_4_ = auVar102._8_4_ * auVar116._8_4_;
        auVar191._12_4_ = auVar102._12_4_ * auVar116._12_4_;
        auVar191._16_4_ = auVar102._16_4_ * fVar164;
        auVar191._20_4_ = auVar102._20_4_ * fVar144;
        auVar191._24_4_ = auVar102._24_4_ * fVar154;
        auVar191._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar191,auVar109,auVar111);
        auVar100 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar91));
        auVar103 = vmulps_avx512vl(auVar105,auVar117);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar110,auVar119);
        auVar53._4_4_ = auVar104._4_4_ * auVar119._4_4_;
        auVar53._0_4_ = auVar104._0_4_ * auVar119._0_4_;
        auVar53._8_4_ = auVar104._8_4_ * auVar119._8_4_;
        auVar53._12_4_ = auVar104._12_4_ * auVar119._12_4_;
        auVar53._16_4_ = auVar104._16_4_ * auVar119._16_4_;
        auVar53._20_4_ = auVar104._20_4_ * auVar119._20_4_;
        auVar53._24_4_ = auVar104._24_4_ * auVar119._24_4_;
        auVar53._28_4_ = auVar119._28_4_;
        auVar91 = vfmsub231ps_fma(auVar53,auVar118,auVar105);
        auVar192._0_4_ = auVar118._0_4_ * auVar110._0_4_;
        auVar192._4_4_ = auVar118._4_4_ * auVar110._4_4_;
        auVar192._8_4_ = auVar118._8_4_ * auVar110._8_4_;
        auVar192._12_4_ = auVar118._12_4_ * auVar110._12_4_;
        auVar192._16_4_ = fVar155 * auVar110._16_4_;
        auVar192._20_4_ = fVar177 * auVar110._20_4_;
        auVar192._24_4_ = fVar156 * auVar110._24_4_;
        auVar192._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar192,auVar104,auVar117);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar96,auVar103);
        auVar101 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar91));
        auVar195 = ZEXT3264(auVar101);
        auVar103 = vmaxps_avx(auVar100,auVar101);
        uVar157 = vcmpps_avx512vl(auVar103,auVar96,2);
        bVar86 = bVar86 & (byte)uVar157;
        if (bVar86 != 0) {
          auVar54._4_4_ = auVar105._4_4_ * auVar102._4_4_;
          auVar54._0_4_ = auVar105._0_4_ * auVar102._0_4_;
          auVar54._8_4_ = auVar105._8_4_ * auVar102._8_4_;
          auVar54._12_4_ = auVar105._12_4_ * auVar102._12_4_;
          auVar54._16_4_ = auVar105._16_4_ * auVar102._16_4_;
          auVar54._20_4_ = auVar105._20_4_ * auVar102._20_4_;
          auVar54._24_4_ = auVar105._24_4_ * auVar102._24_4_;
          auVar54._28_4_ = auVar103._28_4_;
          auVar7 = vfmsub231ps_fma(auVar54,auVar104,auVar111);
          auVar55._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar55._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar55._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar55._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar55._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar55._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar55._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar55._28_4_ = auVar111._28_4_;
          auVar95 = vfmsub231ps_fma(auVar55,auVar107,auVar105);
          auVar56._4_4_ = auVar104._4_4_ * auVar107._4_4_;
          auVar56._0_4_ = auVar104._0_4_ * auVar107._0_4_;
          auVar56._8_4_ = auVar104._8_4_ * auVar107._8_4_;
          auVar56._12_4_ = auVar104._12_4_ * auVar107._12_4_;
          auVar56._16_4_ = auVar104._16_4_ * auVar107._16_4_;
          auVar56._20_4_ = auVar104._20_4_ * auVar107._20_4_;
          auVar56._24_4_ = auVar104._24_4_ * auVar107._24_4_;
          auVar56._28_4_ = auVar104._28_4_;
          auVar8 = vfmsub231ps_fma(auVar56,auVar110,auVar102);
          auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar8));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar7),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar90),auVar32);
          auVar91 = vfmadd132ps_fma(auVar102,auVar103,auVar103);
          auVar197 = ZEXT1664(auVar91);
          auVar57._4_4_ = auVar8._4_4_ * auVar116._4_4_;
          auVar57._0_4_ = auVar8._0_4_ * auVar116._0_4_;
          auVar57._8_4_ = auVar8._8_4_ * auVar116._8_4_;
          auVar57._12_4_ = auVar8._12_4_ * auVar116._12_4_;
          auVar57._16_4_ = fVar164 * 0.0;
          auVar57._20_4_ = fVar144 * 0.0;
          auVar57._24_4_ = fVar154 * 0.0;
          auVar57._28_4_ = iVar1;
          auVar95 = vfmadd231ps_fma(auVar57,auVar109,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,ZEXT1632(auVar7));
          fVar144 = auVar91._0_4_;
          fVar154 = auVar91._4_4_;
          fVar155 = auVar91._8_4_;
          fVar156 = auVar91._12_4_;
          local_280._28_4_ = auVar103._28_4_;
          local_280._0_28_ =
               ZEXT1628(CONCAT412(auVar95._12_4_ * fVar156,
                                  CONCAT48(auVar95._8_4_ * fVar155,
                                           CONCAT44(auVar95._4_4_ * fVar154,auVar95._0_4_ * fVar144)
                                          )));
          auVar202 = ZEXT3264(local_280);
          auVar147._8_4_ = 3;
          auVar147._0_8_ = 0x300000003;
          auVar147._12_4_ = 3;
          auVar147._16_4_ = 3;
          auVar147._20_4_ = 3;
          auVar147._24_4_ = 3;
          auVar147._28_4_ = 3;
          auVar103 = vpermps_avx2(auVar147,ZEXT1632((undefined1  [16])aVar4));
          uVar157 = vcmpps_avx512vl(auVar103,local_280,2);
          fVar164 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar164;
          auVar33._0_4_ = fVar164;
          auVar33._8_4_ = fVar164;
          auVar33._12_4_ = fVar164;
          auVar33._16_4_ = fVar164;
          auVar33._20_4_ = fVar164;
          auVar33._24_4_ = fVar164;
          auVar33._28_4_ = fVar164;
          uVar25 = vcmpps_avx512vl(local_280,auVar33,2);
          bVar86 = (byte)uVar157 & (byte)uVar25 & bVar86;
          if (bVar86 != 0) {
            uVar87 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar87 = bVar86 & uVar87;
            if ((char)uVar87 != '\0') {
              fVar164 = auVar100._0_4_ * fVar144;
              fVar177 = auVar100._4_4_ * fVar154;
              auVar58._4_4_ = fVar177;
              auVar58._0_4_ = fVar164;
              fVar88 = auVar100._8_4_ * fVar155;
              auVar58._8_4_ = fVar88;
              fVar89 = auVar100._12_4_ * fVar156;
              auVar58._12_4_ = fVar89;
              fVar163 = auVar100._16_4_ * 0.0;
              auVar58._16_4_ = fVar163;
              fVar178 = auVar100._20_4_ * 0.0;
              auVar58._20_4_ = fVar178;
              fVar137 = auVar100._24_4_ * 0.0;
              auVar58._24_4_ = fVar137;
              auVar58._28_4_ = auVar100._28_4_;
              auVar148._8_4_ = 0x3f800000;
              auVar148._0_8_ = 0x3f8000003f800000;
              auVar148._12_4_ = 0x3f800000;
              auVar148._16_4_ = 0x3f800000;
              auVar148._20_4_ = 0x3f800000;
              auVar148._24_4_ = 0x3f800000;
              auVar148._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar148,auVar58);
              local_2c0._0_4_ =
                   (float)((uint)(bVar76 & 1) * (int)fVar164 |
                          (uint)!(bool)(bVar76 & 1) * auVar103._0_4_);
              bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
              local_2c0._4_4_ =
                   (float)((uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar103._4_4_);
              bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar18 * (int)fVar88 | (uint)!bVar18 * auVar103._8_4_)
              ;
              bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar18 * (int)fVar89 | (uint)!bVar18 * auVar103._12_4_);
              bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar103._16_4_);
              bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar18 * (int)fVar178 | (uint)!bVar18 * auVar103._20_4_);
              bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar18 * (int)fVar137 | (uint)!bVar18 * auVar103._24_4_);
              bVar18 = SUB81(uVar77 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar103._28_4_);
              auVar103 = vsubps_avx(ZEXT1632(auVar12),auVar98);
              auVar91 = vfmadd213ps_fma(auVar103,local_2c0,auVar98);
              fVar164 = local_518->depth_scale;
              auVar34._4_4_ = fVar164;
              auVar34._0_4_ = fVar164;
              auVar34._8_4_ = fVar164;
              auVar34._12_4_ = fVar164;
              auVar34._16_4_ = fVar164;
              auVar34._20_4_ = fVar164;
              auVar34._24_4_ = fVar164;
              auVar34._28_4_ = fVar164;
              auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                            CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                     CONCAT44(auVar91._4_4_ +
                                                                              auVar91._4_4_,
                                                                              auVar91._0_4_ +
                                                                              auVar91._0_4_)))),
                                         auVar34);
              uVar24 = vcmpps_avx512vl(local_280,auVar103,6);
              uVar87 = uVar87 & uVar24;
              bVar86 = (byte)uVar87;
              if (bVar86 != 0) {
                auVar175._0_4_ = auVar101._0_4_ * fVar144;
                auVar175._4_4_ = auVar101._4_4_ * fVar154;
                auVar175._8_4_ = auVar101._8_4_ * fVar155;
                auVar175._12_4_ = auVar101._12_4_ * fVar156;
                auVar175._16_4_ = auVar101._16_4_ * 0.0;
                auVar175._20_4_ = auVar101._20_4_ * 0.0;
                auVar175._24_4_ = auVar101._24_4_ * 0.0;
                auVar175._28_4_ = 0;
                auVar180._8_4_ = 0x3f800000;
                auVar180._0_8_ = 0x3f8000003f800000;
                auVar180._12_4_ = 0x3f800000;
                auVar180._16_4_ = 0x3f800000;
                auVar180._20_4_ = 0x3f800000;
                auVar180._24_4_ = 0x3f800000;
                auVar180._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar180,auVar175);
                auVar122._0_4_ =
                     (uint)(bVar76 & 1) * (int)auVar175._0_4_ |
                     (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
                bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar122._4_4_ = (uint)bVar18 * (int)auVar175._4_4_ | (uint)!bVar18 * auVar103._4_4_
                ;
                bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar122._8_4_ = (uint)bVar18 * (int)auVar175._8_4_ | (uint)!bVar18 * auVar103._8_4_
                ;
                bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar122._12_4_ =
                     (uint)bVar18 * (int)auVar175._12_4_ | (uint)!bVar18 * auVar103._12_4_;
                bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar122._16_4_ =
                     (uint)bVar18 * (int)auVar175._16_4_ | (uint)!bVar18 * auVar103._16_4_;
                bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar122._20_4_ =
                     (uint)bVar18 * (int)auVar175._20_4_ | (uint)!bVar18 * auVar103._20_4_;
                bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar122._24_4_ =
                     (uint)bVar18 * (int)auVar175._24_4_ | (uint)!bVar18 * auVar103._24_4_;
                auVar122._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar103._28_4_;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar122,auVar180,auVar35);
                local_260 = 0;
                local_25c = iVar14;
                local_250 = local_4b0._0_8_;
                uStack_248 = local_4b0._8_8_;
                local_240 = local_4c0._0_8_;
                uStack_238 = local_4c0._8_8_;
                local_230 = local_4d0._0_8_;
                uStack_228 = local_4d0._8_8_;
                local_220 = local_4e0;
                uStack_218 = uStack_4d8;
                if ((pGVar81->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar164 = 1.0 / auVar205._0_4_;
                  local_200[0] = fVar164 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar164 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar164 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar164 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar164 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar164 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar164 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar149._8_4_ = 0x7f800000;
                  auVar149._0_8_ = 0x7f8000007f800000;
                  auVar149._12_4_ = 0x7f800000;
                  auVar149._16_4_ = 0x7f800000;
                  auVar149._20_4_ = 0x7f800000;
                  auVar149._24_4_ = 0x7f800000;
                  auVar149._28_4_ = 0x7f800000;
                  auVar103 = vblendmps_avx512vl(auVar149,local_280);
                  auVar123._0_4_ =
                       (uint)(bVar86 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar123._4_4_ = (uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar123._8_4_ = (uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar123._12_4_ = (uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar87 >> 4) & 1);
                  auVar123._16_4_ = (uint)bVar18 * auVar103._16_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar87 >> 5) & 1);
                  auVar123._20_4_ = (uint)bVar18 * auVar103._20_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar87 >> 6) & 1);
                  auVar123._24_4_ = (uint)bVar18 * auVar103._24_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = SUB81(uVar87 >> 7,0);
                  auVar123._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * 0x7f800000;
                  auVar103 = vshufps_avx(auVar123,auVar123,0xb1);
                  auVar103 = vminps_avx(auVar123,auVar103);
                  auVar102 = vshufpd_avx(auVar103,auVar103,5);
                  auVar103 = vminps_avx(auVar103,auVar102);
                  auVar102 = vpermpd_avx2(auVar103,0x4e);
                  auVar103 = vminps_avx(auVar103,auVar102);
                  uVar157 = vcmpps_avx512vl(auVar123,auVar103,0);
                  uVar78 = (uint)uVar87;
                  if (((byte)uVar157 & bVar86) != 0) {
                    uVar78 = (uint)((byte)uVar157 & bVar86);
                  }
                  uVar26 = 0;
                  for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                    uVar26 = uVar26 + 1;
                  }
                  uVar77 = (ulong)uVar26;
                  if ((local_538->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_420 = local_280;
                    pRVar82 = local_538;
                    do {
                      local_494 = local_200[uVar77];
                      local_490 = *(undefined4 *)(local_1e0 + uVar77 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar77 * 4);
                      local_510.context = pRVar82->user;
                      fVar164 = 1.0 - local_494;
                      auVar31._8_4_ = 0x80000000;
                      auVar31._0_8_ = 0x8000000080000000;
                      auVar31._12_4_ = 0x80000000;
                      auVar95 = vxorps_avx512vl(ZEXT416((uint)fVar164),auVar31);
                      auVar91 = ZEXT416((uint)(local_494 * fVar164 * 4.0));
                      auVar90 = vfnmsub213ss_fma(ZEXT416((uint)local_494),ZEXT416((uint)local_494),
                                                 auVar91);
                      auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),
                                                auVar91);
                      fVar164 = fVar164 * auVar95._0_4_ * 0.5;
                      fVar144 = auVar90._0_4_ * 0.5;
                      auVar197 = ZEXT464((uint)fVar144);
                      fVar154 = auVar91._0_4_ * 0.5;
                      fVar155 = local_494 * local_494 * 0.5;
                      auVar189._0_4_ = fVar155 * (float)local_4e0._0_4_;
                      auVar189._4_4_ = fVar155 * (float)local_4e0._4_4_;
                      auVar189._8_4_ = fVar155 * (float)uStack_4d8;
                      auVar189._12_4_ = fVar155 * uStack_4d8._4_4_;
                      auVar171._4_4_ = fVar154;
                      auVar171._0_4_ = fVar154;
                      auVar171._8_4_ = fVar154;
                      auVar171._12_4_ = fVar154;
                      auVar91 = vfmadd132ps_fma(auVar171,auVar189,local_4d0);
                      auVar190._4_4_ = fVar144;
                      auVar190._0_4_ = fVar144;
                      auVar190._8_4_ = fVar144;
                      auVar190._12_4_ = fVar144;
                      auVar91 = vfmadd132ps_fma(auVar190,auVar91,local_4c0);
                      auVar195 = ZEXT1664(auVar91);
                      auVar172._4_4_ = fVar164;
                      auVar172._0_4_ = fVar164;
                      auVar172._8_4_ = fVar164;
                      auVar172._12_4_ = fVar164;
                      auVar90 = vfmadd132ps_fma(auVar172,auVar91,local_4b0);
                      local_4a0 = vmovlps_avx(auVar90);
                      local_498 = vextractps_avx(auVar90,2);
                      local_48c = (int)local_528;
                      local_488 = (int)local_530;
                      local_484 = (local_510.context)->instID[0];
                      local_480 = (local_510.context)->instPrimID[0];
                      local_53c = -1;
                      local_510.valid = &local_53c;
                      local_510.geometryUserPtr = pGVar81->userPtr;
                      local_510.ray = (RTCRayN *)ray;
                      local_510.hit = (RTCHitN *)&local_4a0;
                      local_510.N = 1;
                      if (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01e0b36b:
                        p_Var17 = pRVar82->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar82->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar81->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar195 = ZEXT1664(auVar195._0_16_);
                          auVar197 = ZEXT1664(auVar197._0_16_);
                          (*p_Var17)(&local_510);
                          auVar202 = ZEXT3264(local_420);
                          auVar217 = ZEXT464(0xbf800000);
                          auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar216 = ZEXT3264(auVar103);
                          auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
                          auVar218 = ZEXT3264(auVar103);
                          pRVar82 = local_538;
                          if (*local_510.valid == 0) goto LAB_01e0b41f;
                        }
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                             *(float *)local_510.hit;
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_510.hit + 4);
                        (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_510.hit + 8);
                        *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                        *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                        *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                        *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                        *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                        *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                      }
                      else {
                        auVar195 = ZEXT1664(auVar91);
                        auVar197 = ZEXT464((uint)fVar144);
                        (*pGVar81->intersectionFilterN)(&local_510);
                        auVar202 = ZEXT3264(local_420);
                        auVar217 = ZEXT464(0xbf800000);
                        auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar216 = ZEXT3264(auVar103);
                        auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar218 = ZEXT3264(auVar103);
                        pRVar82 = local_538;
                        if (*local_510.valid != 0) goto LAB_01e0b36b;
LAB_01e0b41f:
                        auVar217 = ZEXT464(0xbf800000);
                        (ray->super_RayK<1>).tfar = (float)local_400._0_4_;
                        pRVar82 = local_538;
                      }
                      bVar86 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar87;
                      fVar164 = (ray->super_RayK<1>).tfar;
                      auVar42._4_4_ = fVar164;
                      auVar42._0_4_ = fVar164;
                      auVar42._8_4_ = fVar164;
                      auVar42._12_4_ = fVar164;
                      auVar42._16_4_ = fVar164;
                      auVar42._20_4_ = fVar164;
                      auVar42._24_4_ = fVar164;
                      auVar42._28_4_ = fVar164;
                      uVar157 = vcmpps_avx512vl(auVar202._0_32_,auVar42,2);
                      prim = local_520;
                      if ((bVar86 & (byte)uVar157) == 0) goto LAB_01e0a572;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar86 = bVar86 & (byte)uVar157;
                      uVar87 = (ulong)bVar86;
                      auVar153._8_4_ = 0x7f800000;
                      auVar153._0_8_ = 0x7f8000007f800000;
                      auVar153._12_4_ = 0x7f800000;
                      auVar153._16_4_ = 0x7f800000;
                      auVar153._20_4_ = 0x7f800000;
                      auVar153._24_4_ = 0x7f800000;
                      auVar153._28_4_ = 0x7f800000;
                      auVar103 = vblendmps_avx512vl(auVar153,auVar202._0_32_);
                      auVar136._0_4_ =
                           (uint)(bVar86 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                      bVar18 = (bool)(bVar86 >> 1 & 1);
                      auVar136._4_4_ = (uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar86 >> 2 & 1);
                      auVar136._8_4_ = (uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar86 >> 3 & 1);
                      auVar136._12_4_ = (uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar86 >> 4 & 1);
                      auVar136._16_4_ = (uint)bVar18 * auVar103._16_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar86 >> 5 & 1);
                      auVar136._20_4_ = (uint)bVar18 * auVar103._20_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar86 >> 6 & 1);
                      auVar136._24_4_ = (uint)bVar18 * auVar103._24_4_ | (uint)!bVar18 * 0x7f800000;
                      auVar136._28_4_ =
                           (uint)(bVar86 >> 7) * auVar103._28_4_ |
                           (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                      auVar103 = vshufps_avx(auVar136,auVar136,0xb1);
                      auVar103 = vminps_avx(auVar136,auVar103);
                      auVar102 = vshufpd_avx(auVar103,auVar103,5);
                      auVar103 = vminps_avx(auVar103,auVar102);
                      auVar102 = vpermpd_avx2(auVar103,0x4e);
                      auVar103 = vminps_avx(auVar103,auVar102);
                      uVar157 = vcmpps_avx512vl(auVar136,auVar103,0);
                      bVar76 = (byte)uVar157 & bVar86;
                      if (bVar76 != 0) {
                        bVar86 = bVar76;
                      }
                      uVar84 = 0;
                      for (uVar79 = (uint)bVar86; (uVar79 & 1) == 0;
                          uVar79 = uVar79 >> 1 | 0x80000000) {
                        uVar84 = uVar84 + 1;
                      }
                      uVar77 = (ulong)uVar84;
                    } while( true );
                  }
                  fVar164 = local_200[uVar77];
                  fVar144 = *(float *)(local_1e0 + uVar77 * 4);
                  fVar154 = 1.0 - fVar164;
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar95 = vxorps_avx512vl(ZEXT416((uint)fVar154),auVar28);
                  auVar91 = ZEXT416((uint)(fVar164 * fVar154 * 4.0));
                  auVar90 = vfnmsub213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),auVar91);
                  auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),auVar91);
                  fVar154 = fVar154 * auVar95._0_4_ * 0.5;
                  fVar155 = auVar90._0_4_ * 0.5;
                  auVar197 = ZEXT464((uint)fVar155);
                  fVar156 = auVar91._0_4_ * 0.5;
                  fVar177 = fVar164 * fVar164 * 0.5;
                  auVar183._0_4_ = fVar177 * (float)local_4e0._0_4_;
                  auVar183._4_4_ = fVar177 * (float)local_4e0._4_4_;
                  auVar183._8_4_ = fVar177 * (float)uStack_4d8;
                  auVar183._12_4_ = fVar177 * uStack_4d8._4_4_;
                  auVar165._4_4_ = fVar156;
                  auVar165._0_4_ = fVar156;
                  auVar165._8_4_ = fVar156;
                  auVar165._12_4_ = fVar156;
                  auVar91 = vfmadd132ps_fma(auVar165,auVar183,local_4d0);
                  auVar184._4_4_ = fVar155;
                  auVar184._0_4_ = fVar155;
                  auVar184._8_4_ = fVar155;
                  auVar184._12_4_ = fVar155;
                  auVar91 = vfmadd132ps_fma(auVar184,auVar91,local_4c0);
                  auVar195 = ZEXT1664(auVar91);
                  auVar166._4_4_ = fVar154;
                  auVar166._0_4_ = fVar154;
                  auVar166._8_4_ = fVar154;
                  auVar166._12_4_ = fVar154;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar77 * 4);
                  auVar91 = vfmadd132ps_fma(auVar166,auVar91,local_4b0);
                  uVar157 = vmovlps_avx(auVar91);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar157;
                  fVar154 = (float)vextractps_avx(auVar91,2);
                  (ray->Ng).field_0.field_0.z = fVar154;
                  ray->u = fVar164;
                  ray->v = fVar144;
                  ray->primID = uVar79;
                  ray->geomID = uVar84;
                  ray->instID[0] = local_538->user->instID[0];
                  ray->instPrimID[0] = local_538->user->instPrimID[0];
                  prim = local_520;
                }
              }
            }
          }
        }
      }
LAB_01e0a572:
      context = local_538;
      if (8 < iVar14) {
        local_400 = vpbroadcastd_avx512vl();
        local_420._4_4_ = local_440._0_4_;
        local_420._0_4_ = local_440._0_4_;
        local_420._8_4_ = local_440._0_4_;
        local_420._12_4_ = local_440._0_4_;
        local_420._16_4_ = local_440._0_4_;
        local_420._20_4_ = local_440._0_4_;
        local_420._24_4_ = local_440._0_4_;
        local_420._28_4_ = local_440._0_4_;
        auVar150._8_4_ = 3;
        auVar150._0_8_ = 0x300000003;
        auVar150._12_4_ = 3;
        auVar150._16_4_ = 3;
        auVar150._20_4_ = 3;
        auVar150._24_4_ = 3;
        auVar150._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar150,local_3e0);
        local_120 = 1.0 / (float)local_460._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar83 = 8;
LAB_01e0a612:
        auVar103 = vpbroadcastd_avx512vl();
        auVar103 = vpor_avx2(auVar103,_DAT_01fe9900);
        uVar25 = vpcmpd_avx512vl(auVar103,local_400,1);
        auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar83 * 4 + lVar27);
        auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21aefac + lVar83 * 4);
        auVar111 = *(undefined1 (*) [32])(lVar27 + 0x21af430 + lVar83 * 4);
        auVar110 = *(undefined1 (*) [32])(lVar27 + 0x21af8b4 + lVar83 * 4);
        auVar198._0_4_ = auVar110._0_4_ * (float)local_3a0._0_4_;
        auVar198._4_4_ = auVar110._4_4_ * (float)local_3a0._4_4_;
        auVar198._8_4_ = auVar110._8_4_ * fStack_398;
        auVar198._12_4_ = auVar110._12_4_ * fStack_394;
        auVar198._16_4_ = auVar110._16_4_ * fStack_390;
        auVar198._20_4_ = auVar110._20_4_ * fStack_38c;
        auVar198._28_36_ = auVar197._28_36_;
        auVar198._24_4_ = auVar110._24_4_ * fStack_388;
        auVar197._0_4_ = auVar110._0_4_ * (float)local_3c0._0_4_;
        auVar197._4_4_ = auVar110._4_4_ * (float)local_3c0._4_4_;
        auVar197._8_4_ = auVar110._8_4_ * fStack_3b8;
        auVar197._12_4_ = auVar110._12_4_ * fStack_3b4;
        auVar197._16_4_ = auVar110._16_4_ * fStack_3b0;
        auVar197._20_4_ = auVar110._20_4_ * fStack_3ac;
        auVar197._28_36_ = auVar195._28_36_;
        auVar197._24_4_ = auVar110._24_4_ * fStack_3a8;
        auVar104 = vmulps_avx512vl(local_100,auVar110);
        auVar105 = vfmadd231ps_avx512vl(auVar198._0_32_,auVar111,local_360);
        auVar106 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar111,local_380);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_e0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_320);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_340);
        auVar109 = vfmadd231ps_avx512vl(auVar104,auVar102,local_c0);
        auVar91 = vfmadd231ps_fma(auVar105,auVar103,local_2e0);
        auVar197 = ZEXT1664(auVar91);
        auVar90 = vfmadd231ps_fma(auVar106,auVar103,local_300);
        auVar195 = ZEXT1664(auVar90);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar83 * 4 + lVar27);
        auVar105 = *(undefined1 (*) [32])(lVar27 + 0x21b13cc + lVar83 * 4);
        auVar101 = vfmadd231ps_avx512vl(auVar109,auVar103,local_a0);
        auVar106 = *(undefined1 (*) [32])(lVar27 + 0x21b1850 + lVar83 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar27 + 0x21b1cd4 + lVar83 * 4);
        auVar203._0_4_ = auVar109._0_4_ * (float)local_3a0._0_4_;
        auVar203._4_4_ = auVar109._4_4_ * (float)local_3a0._4_4_;
        auVar203._8_4_ = auVar109._8_4_ * fStack_398;
        auVar203._12_4_ = auVar109._12_4_ * fStack_394;
        auVar203._16_4_ = auVar109._16_4_ * fStack_390;
        auVar203._20_4_ = auVar109._20_4_ * fStack_38c;
        auVar203._28_36_ = auVar202._28_36_;
        auVar203._24_4_ = auVar109._24_4_ * fStack_388;
        auVar59._4_4_ = auVar109._4_4_ * (float)local_3c0._4_4_;
        auVar59._0_4_ = auVar109._0_4_ * (float)local_3c0._0_4_;
        auVar59._8_4_ = auVar109._8_4_ * fStack_3b8;
        auVar59._12_4_ = auVar109._12_4_ * fStack_3b4;
        auVar59._16_4_ = auVar109._16_4_ * fStack_3b0;
        auVar59._20_4_ = auVar109._20_4_ * fStack_3ac;
        auVar59._24_4_ = auVar109._24_4_ * fStack_3a8;
        auVar59._28_4_ = uStack_3a4;
        auVar107 = vmulps_avx512vl(local_100,auVar109);
        auVar100 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar106,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar59,auVar106,local_380);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_340);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_c0);
        auVar95 = vfmadd231ps_fma(auVar100,auVar104,local_2e0);
        auVar202 = ZEXT1664(auVar95);
        auVar7 = vfmadd231ps_fma(auVar96,auVar104,local_300);
        auVar96 = vfmadd231ps_avx512vl(auVar107,auVar104,local_a0);
        auVar97 = vmaxps_avx512vl(auVar101,auVar96);
        auVar107 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar91));
        auVar100 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar90));
        auVar98 = vmulps_avx512vl(ZEXT1632(auVar90),auVar107);
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar91),auVar100);
        auVar98 = vsubps_avx512vl(auVar98,auVar99);
        auVar99 = vmulps_avx512vl(auVar100,auVar100);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,auVar107);
        auVar97 = vmulps_avx512vl(auVar97,auVar97);
        auVar97 = vmulps_avx512vl(auVar97,auVar99);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        uVar157 = vcmpps_avx512vl(auVar98,auVar97,2);
        bVar86 = (byte)uVar25 & (byte)uVar157;
        if (bVar86 != 0) {
          auVar109 = vmulps_avx512vl(local_1a0,auVar109);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_180,auVar109);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar106);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar105);
          auVar110 = vmulps_avx512vl(local_1a0,auVar110);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar110);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar111);
          auVar105 = vfmadd213ps_avx512vl(auVar103,local_140,auVar102);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21afd38 + lVar83 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b01bc + lVar83 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar27 + 0x21b0640 + lVar83 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar27 + 0x21b0ac4 + lVar83 * 4);
          auVar106 = vmulps_avx512vl(_local_3a0,auVar110);
          auVar109 = vmulps_avx512vl(_local_3c0,auVar110);
          auVar110 = vmulps_avx512vl(local_1a0,auVar110);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,local_360);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,local_380);
          auVar111 = vfmadd231ps_avx512vl(auVar110,local_180,auVar111);
          auVar110 = vfmadd231ps_avx512vl(auVar106,auVar102,local_320);
          auVar106 = vfmadd231ps_avx512vl(auVar109,auVar102,local_340);
          auVar102 = vfmadd231ps_avx512vl(auVar111,local_160,auVar102);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,local_2e0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_300);
          auVar109 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21b2158 + lVar83 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b2a60 + lVar83 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar27 + 0x21b2ee4 + lVar83 * 4);
          auVar97 = vmulps_avx512vl(_local_3a0,auVar111);
          auVar98 = vmulps_avx512vl(_local_3c0,auVar111);
          auVar111 = vmulps_avx512vl(local_1a0,auVar111);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_360);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_380);
          auVar111 = vfmadd231ps_avx512vl(auVar111,local_180,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b25dc + lVar83 * 4);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_320);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_340);
          auVar102 = vfmadd231ps_avx512vl(auVar111,local_160,auVar102);
          auVar111 = vfmadd231ps_avx512vl(auVar97,auVar103,local_2e0);
          auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,local_300);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar110,auVar98);
          vandps_avx512vl(auVar106,auVar98);
          auVar103 = vmaxps_avx(auVar98,auVar98);
          vandps_avx512vl(auVar109,auVar98);
          auVar103 = vmaxps_avx(auVar103,auVar98);
          uVar77 = vcmpps_avx512vl(auVar103,local_420,1);
          bVar18 = (bool)((byte)uVar77 & 1);
          auVar124._0_4_ = (float)((uint)bVar18 * auVar107._0_4_ | (uint)!bVar18 * auVar110._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar110._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar110._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar110._12_4_);
          bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * auVar110._16_4_);
          bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar18 * auVar107._20_4_ | (uint)!bVar18 * auVar110._20_4_);
          bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar18 * auVar107._24_4_ | (uint)!bVar18 * auVar110._24_4_);
          bVar18 = SUB81(uVar77 >> 7,0);
          auVar124._28_4_ = (uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * auVar110._28_4_;
          bVar18 = (bool)((byte)uVar77 & 1);
          auVar125._0_4_ = (float)((uint)bVar18 * auVar100._0_4_ | (uint)!bVar18 * auVar106._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar106._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar106._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar106._12_4_);
          bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * auVar106._16_4_);
          bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * auVar106._20_4_);
          bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * auVar106._24_4_);
          bVar18 = SUB81(uVar77 >> 7,0);
          auVar125._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar106._28_4_;
          vandps_avx512vl(auVar111,auVar98);
          vandps_avx512vl(auVar97,auVar98);
          auVar103 = vmaxps_avx(auVar125,auVar125);
          vandps_avx512vl(auVar102,auVar98);
          auVar103 = vmaxps_avx(auVar103,auVar125);
          uVar77 = vcmpps_avx512vl(auVar103,local_420,1);
          bVar18 = (bool)((byte)uVar77 & 1);
          auVar126._0_4_ = (uint)bVar18 * auVar107._0_4_ | (uint)!bVar18 * auVar111._0_4_;
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar111._4_4_;
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar111._8_4_;
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar111._12_4_;
          bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * auVar111._16_4_;
          bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar18 * auVar107._20_4_ | (uint)!bVar18 * auVar111._20_4_;
          bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar18 * auVar107._24_4_ | (uint)!bVar18 * auVar111._24_4_;
          bVar18 = SUB81(uVar77 >> 7,0);
          auVar126._28_4_ = (uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * auVar111._28_4_;
          bVar18 = (bool)((byte)uVar77 & 1);
          auVar127._0_4_ = (float)((uint)bVar18 * auVar100._0_4_ | (uint)!bVar18 * auVar97._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar97._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar97._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar97._12_4_)
          ;
          bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar127._16_4_ = (float)((uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * auVar97._16_4_)
          ;
          bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar127._20_4_ = (float)((uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * auVar97._20_4_)
          ;
          bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar127._24_4_ = (float)((uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * auVar97._24_4_)
          ;
          bVar18 = SUB81(uVar77 >> 7,0);
          auVar127._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar97._28_4_;
          auVar208._8_4_ = 0x80000000;
          auVar208._0_8_ = 0x8000000080000000;
          auVar208._12_4_ = 0x80000000;
          auVar208._16_4_ = 0x80000000;
          auVar208._20_4_ = 0x80000000;
          auVar208._24_4_ = 0x80000000;
          auVar208._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar126,auVar208);
          auVar92 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
          auVar102 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar92));
          auVar8 = vfmadd231ps_fma(auVar102,auVar125,auVar125);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
          auVar215._8_4_ = 0xbf000000;
          auVar215._0_8_ = 0xbf000000bf000000;
          auVar215._12_4_ = 0xbf000000;
          auVar215._16_4_ = 0xbf000000;
          auVar215._20_4_ = 0xbf000000;
          auVar215._24_4_ = 0xbf000000;
          auVar215._28_4_ = 0xbf000000;
          fVar164 = auVar102._0_4_;
          fVar144 = auVar102._4_4_;
          fVar154 = auVar102._8_4_;
          fVar155 = auVar102._12_4_;
          fVar156 = auVar102._16_4_;
          fVar177 = auVar102._20_4_;
          fVar88 = auVar102._24_4_;
          auVar60._4_4_ = fVar144 * fVar144 * fVar144 * auVar8._4_4_ * -0.5;
          auVar60._0_4_ = fVar164 * fVar164 * fVar164 * auVar8._0_4_ * -0.5;
          auVar60._8_4_ = fVar154 * fVar154 * fVar154 * auVar8._8_4_ * -0.5;
          auVar60._12_4_ = fVar155 * fVar155 * fVar155 * auVar8._12_4_ * -0.5;
          auVar60._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
          auVar60._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar60._24_4_ = fVar88 * fVar88 * fVar88 * -0.0;
          auVar60._28_4_ = auVar125._28_4_;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar60,auVar111,auVar102);
          auVar61._4_4_ = auVar125._4_4_ * auVar102._4_4_;
          auVar61._0_4_ = auVar125._0_4_ * auVar102._0_4_;
          auVar61._8_4_ = auVar125._8_4_ * auVar102._8_4_;
          auVar61._12_4_ = auVar125._12_4_ * auVar102._12_4_;
          auVar61._16_4_ = auVar125._16_4_ * auVar102._16_4_;
          auVar61._20_4_ = auVar125._20_4_ * auVar102._20_4_;
          auVar61._24_4_ = auVar125._24_4_ * auVar102._24_4_;
          auVar61._28_4_ = 0;
          auVar62._4_4_ = auVar102._4_4_ * -auVar124._4_4_;
          auVar62._0_4_ = auVar102._0_4_ * -auVar124._0_4_;
          auVar62._8_4_ = auVar102._8_4_ * -auVar124._8_4_;
          auVar62._12_4_ = auVar102._12_4_ * -auVar124._12_4_;
          auVar62._16_4_ = auVar102._16_4_ * -auVar124._16_4_;
          auVar62._20_4_ = auVar102._20_4_ * -auVar124._20_4_;
          auVar62._24_4_ = auVar102._24_4_ * -auVar124._24_4_;
          auVar62._28_4_ = auVar125._28_4_;
          auVar110 = vmulps_avx512vl(auVar102,ZEXT1632(auVar92));
          auVar109 = ZEXT1632(auVar92);
          auVar102 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar109);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar127,auVar127);
          auVar106 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar215);
          fVar164 = auVar106._0_4_;
          fVar144 = auVar106._4_4_;
          fVar154 = auVar106._8_4_;
          fVar155 = auVar106._12_4_;
          fVar156 = auVar106._16_4_;
          fVar177 = auVar106._20_4_;
          fVar88 = auVar106._24_4_;
          auVar63._4_4_ = fVar144 * fVar144 * fVar144 * auVar102._4_4_;
          auVar63._0_4_ = fVar164 * fVar164 * fVar164 * auVar102._0_4_;
          auVar63._8_4_ = fVar154 * fVar154 * fVar154 * auVar102._8_4_;
          auVar63._12_4_ = fVar155 * fVar155 * fVar155 * auVar102._12_4_;
          auVar63._16_4_ = fVar156 * fVar156 * fVar156 * auVar102._16_4_;
          auVar63._20_4_ = fVar177 * fVar177 * fVar177 * auVar102._20_4_;
          auVar63._24_4_ = fVar88 * fVar88 * fVar88 * auVar102._24_4_;
          auVar63._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar63,auVar111,auVar106);
          auVar64._4_4_ = auVar127._4_4_ * auVar102._4_4_;
          auVar64._0_4_ = auVar127._0_4_ * auVar102._0_4_;
          auVar64._8_4_ = auVar127._8_4_ * auVar102._8_4_;
          auVar64._12_4_ = auVar127._12_4_ * auVar102._12_4_;
          auVar64._16_4_ = auVar127._16_4_ * auVar102._16_4_;
          auVar64._20_4_ = auVar127._20_4_ * auVar102._20_4_;
          auVar64._24_4_ = auVar127._24_4_ * auVar102._24_4_;
          auVar64._28_4_ = auVar106._28_4_;
          auVar65._4_4_ = auVar102._4_4_ * auVar103._4_4_;
          auVar65._0_4_ = auVar102._0_4_ * auVar103._0_4_;
          auVar65._8_4_ = auVar102._8_4_ * auVar103._8_4_;
          auVar65._12_4_ = auVar102._12_4_ * auVar103._12_4_;
          auVar65._16_4_ = auVar102._16_4_ * auVar103._16_4_;
          auVar65._20_4_ = auVar102._20_4_ * auVar103._20_4_;
          auVar65._24_4_ = auVar102._24_4_ * auVar103._24_4_;
          auVar65._28_4_ = auVar103._28_4_;
          auVar103 = vmulps_avx512vl(auVar102,auVar109);
          auVar8 = vfmadd213ps_fma(auVar61,auVar101,ZEXT1632(auVar91));
          auVar9 = vfmadd213ps_fma(auVar62,auVar101,ZEXT1632(auVar90));
          auVar111 = vfmadd213ps_avx512vl(auVar110,auVar101,auVar105);
          auVar106 = vfmadd213ps_avx512vl(auVar64,auVar96,ZEXT1632(auVar95));
          auVar11 = vfnmadd213ps_fma(auVar61,auVar101,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar65,auVar96,ZEXT1632(auVar7));
          auVar12 = vfnmadd213ps_fma(auVar62,auVar101,ZEXT1632(auVar90));
          auVar90 = vfmadd213ps_fma(auVar103,auVar96,auVar104);
          auVar159 = vfnmadd231ps_fma(auVar105,auVar101,auVar110);
          auVar146 = vfnmadd213ps_fma(auVar64,auVar96,ZEXT1632(auVar95));
          auVar158 = vfnmadd213ps_fma(auVar65,auVar96,ZEXT1632(auVar7));
          auVar160 = vfnmadd231ps_fma(auVar104,auVar96,auVar103);
          auVar104 = vsubps_avx512vl(auVar106,ZEXT1632(auVar11));
          auVar103 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar12));
          auVar102 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar159));
          auVar66._4_4_ = auVar103._4_4_ * auVar159._4_4_;
          auVar66._0_4_ = auVar103._0_4_ * auVar159._0_4_;
          auVar66._8_4_ = auVar103._8_4_ * auVar159._8_4_;
          auVar66._12_4_ = auVar103._12_4_ * auVar159._12_4_;
          auVar66._16_4_ = auVar103._16_4_ * 0.0;
          auVar66._20_4_ = auVar103._20_4_ * 0.0;
          auVar66._24_4_ = auVar103._24_4_ * 0.0;
          auVar66._28_4_ = auVar110._28_4_;
          auVar95 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar12),auVar102);
          auVar67._4_4_ = auVar102._4_4_ * auVar11._4_4_;
          auVar67._0_4_ = auVar102._0_4_ * auVar11._0_4_;
          auVar67._8_4_ = auVar102._8_4_ * auVar11._8_4_;
          auVar67._12_4_ = auVar102._12_4_ * auVar11._12_4_;
          auVar67._16_4_ = auVar102._16_4_ * 0.0;
          auVar67._20_4_ = auVar102._20_4_ * 0.0;
          auVar67._24_4_ = auVar102._24_4_ * 0.0;
          auVar67._28_4_ = auVar102._28_4_;
          auVar7 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar159),auVar104);
          auVar68._4_4_ = auVar12._4_4_ * auVar104._4_4_;
          auVar68._0_4_ = auVar12._0_4_ * auVar104._0_4_;
          auVar68._8_4_ = auVar12._8_4_ * auVar104._8_4_;
          auVar68._12_4_ = auVar12._12_4_ * auVar104._12_4_;
          auVar68._16_4_ = auVar104._16_4_ * 0.0;
          auVar68._20_4_ = auVar104._20_4_ * 0.0;
          auVar68._24_4_ = auVar104._24_4_ * 0.0;
          auVar68._28_4_ = auVar104._28_4_;
          auVar10 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar11),auVar103);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar109,ZEXT1632(auVar7));
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,ZEXT1632(auVar95));
          auVar98 = ZEXT1632(auVar92);
          uVar77 = vcmpps_avx512vl(auVar103,auVar98,2);
          bVar76 = (byte)uVar77;
          fVar178 = (float)((uint)(bVar76 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar146._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar138 = (float)((uint)bVar18 * auVar8._4_4_ | (uint)!bVar18 * auVar146._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar141 = (float)((uint)bVar18 * auVar8._8_4_ | (uint)!bVar18 * auVar146._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar142 = (float)((uint)bVar18 * auVar8._12_4_ | (uint)!bVar18 * auVar146._12_4_);
          auVar109 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar141,CONCAT44(fVar138,fVar178))));
          fVar137 = (float)((uint)(bVar76 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar76 & 1) * auVar158._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar140 = (float)((uint)bVar18 * auVar9._4_4_ | (uint)!bVar18 * auVar158._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar139 = (float)((uint)bVar18 * auVar9._8_4_ | (uint)!bVar18 * auVar158._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar143 = (float)((uint)bVar18 * auVar9._12_4_ | (uint)!bVar18 * auVar158._12_4_);
          auVar107 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar139,CONCAT44(fVar140,fVar137))));
          auVar128._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar111._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar160._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar18 * auVar111._4_4_ | (uint)!bVar18 * auVar160._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar18 * auVar111._8_4_ | (uint)!bVar18 * auVar160._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar18 * auVar111._12_4_ | (uint)!bVar18 * auVar160._12_4_);
          fVar164 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_);
          auVar128._16_4_ = fVar164;
          fVar144 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_);
          auVar128._20_4_ = fVar144;
          fVar154 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_);
          auVar128._24_4_ = fVar154;
          iVar1 = (uint)(byte)(uVar77 >> 7) * auVar111._28_4_;
          auVar128._28_4_ = iVar1;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar106);
          auVar129._0_4_ =
               (uint)(bVar76 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar95._0_4_;
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * auVar95._4_4_;
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * auVar95._8_4_;
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar95._12_4_;
          auVar129._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_;
          auVar129._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_;
          auVar129._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_;
          auVar129._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar91));
          auVar130._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar8._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * auVar8._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * auVar8._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar130._12_4_ = (float)((uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar8._12_4_);
          fVar177 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
          auVar130._16_4_ = fVar177;
          fVar156 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
          auVar130._20_4_ = fVar156;
          fVar155 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
          auVar130._24_4_ = fVar155;
          auVar130._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar103 = vblendmps_avx512vl(ZEXT1632(auVar159),ZEXT1632(auVar90));
          auVar131._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar9._0_4_);
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * auVar9._4_4_);
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * auVar9._8_4_);
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar9._12_4_);
          fVar89 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar103._16_4_);
          auVar131._16_4_ = fVar89;
          fVar163 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar103._20_4_);
          auVar131._20_4_ = fVar163;
          fVar88 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar103._24_4_);
          auVar131._24_4_ = fVar88;
          iVar2 = (uint)(byte)(uVar77 >> 7) * auVar103._28_4_;
          auVar131._28_4_ = iVar2;
          auVar132._0_4_ =
               (uint)(bVar76 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar106._0_4_;
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar18 * (int)auVar11._4_4_ | (uint)!bVar18 * auVar106._4_4_;
          bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar18 * (int)auVar11._8_4_ | (uint)!bVar18 * auVar106._8_4_;
          bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar18 * (int)auVar11._12_4_ | (uint)!bVar18 * auVar106._12_4_;
          auVar132._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar106._16_4_;
          auVar132._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar106._20_4_;
          auVar132._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar106._24_4_;
          auVar132._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar106._28_4_;
          bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar106 = vsubps_avx512vl(auVar132,auVar109);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar12._12_4_ |
                                                   (uint)!bVar22 * auVar91._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar12._8_4_ |
                                                            (uint)!bVar20 * auVar91._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar12._4_4_ |
                                                                     (uint)!bVar18 * auVar91._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar12._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar91._0_4_)))),auVar107);
          auVar197 = ZEXT3264(auVar102);
          auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar159._12_4_ |
                                                   (uint)!bVar23 * auVar90._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar159._8_4_ |
                                                            (uint)!bVar21 * auVar90._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar159._4_4_ |
                                                                     (uint)!bVar19 * auVar90._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar159._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar90._0_4_)))),auVar128);
          auVar110 = vsubps_avx(auVar109,auVar129);
          auVar202 = ZEXT3264(auVar110);
          auVar104 = vsubps_avx(auVar107,auVar130);
          auVar105 = vsubps_avx(auVar128,auVar131);
          auVar69._4_4_ = auVar111._4_4_ * fVar138;
          auVar69._0_4_ = auVar111._0_4_ * fVar178;
          auVar69._8_4_ = auVar111._8_4_ * fVar141;
          auVar69._12_4_ = auVar111._12_4_ * fVar142;
          auVar69._16_4_ = auVar111._16_4_ * 0.0;
          auVar69._20_4_ = auVar111._20_4_ * 0.0;
          auVar69._24_4_ = auVar111._24_4_ * 0.0;
          auVar69._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar69,auVar128,auVar106);
          auVar181._0_4_ = fVar137 * auVar106._0_4_;
          auVar181._4_4_ = fVar140 * auVar106._4_4_;
          auVar181._8_4_ = fVar139 * auVar106._8_4_;
          auVar181._12_4_ = fVar143 * auVar106._12_4_;
          auVar181._16_4_ = auVar106._16_4_ * 0.0;
          auVar181._20_4_ = auVar106._20_4_ * 0.0;
          auVar181._24_4_ = auVar106._24_4_ * 0.0;
          auVar181._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar181,auVar109,auVar102);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar98,ZEXT1632(auVar91));
          auVar193._0_4_ = auVar102._0_4_ * auVar128._0_4_;
          auVar193._4_4_ = auVar102._4_4_ * auVar128._4_4_;
          auVar193._8_4_ = auVar102._8_4_ * auVar128._8_4_;
          auVar193._12_4_ = auVar102._12_4_ * auVar128._12_4_;
          auVar193._16_4_ = auVar102._16_4_ * fVar164;
          auVar193._20_4_ = auVar102._20_4_ * fVar144;
          auVar193._24_4_ = auVar102._24_4_ * fVar154;
          auVar193._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar193,auVar107,auVar111);
          auVar100 = vfmadd231ps_avx512vl(auVar103,auVar98,ZEXT1632(auVar91));
          auVar103 = vmulps_avx512vl(auVar105,auVar129);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar110,auVar131);
          auVar70._4_4_ = auVar104._4_4_ * auVar131._4_4_;
          auVar70._0_4_ = auVar104._0_4_ * auVar131._0_4_;
          auVar70._8_4_ = auVar104._8_4_ * auVar131._8_4_;
          auVar70._12_4_ = auVar104._12_4_ * auVar131._12_4_;
          auVar70._16_4_ = auVar104._16_4_ * fVar89;
          auVar70._20_4_ = auVar104._20_4_ * fVar163;
          auVar70._24_4_ = auVar104._24_4_ * fVar88;
          auVar70._28_4_ = iVar2;
          auVar91 = vfmsub231ps_fma(auVar70,auVar130,auVar105);
          auVar194._0_4_ = auVar130._0_4_ * auVar110._0_4_;
          auVar194._4_4_ = auVar130._4_4_ * auVar110._4_4_;
          auVar194._8_4_ = auVar130._8_4_ * auVar110._8_4_;
          auVar194._12_4_ = auVar130._12_4_ * auVar110._12_4_;
          auVar194._16_4_ = fVar177 * auVar110._16_4_;
          auVar194._20_4_ = fVar156 * auVar110._20_4_;
          auVar194._24_4_ = fVar155 * auVar110._24_4_;
          auVar194._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar194,auVar104,auVar129);
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar98,auVar103);
          auVar97 = vfmadd231ps_avx512vl(auVar103,auVar98,ZEXT1632(auVar91));
          auVar195 = ZEXT3264(auVar97);
          auVar103 = vmaxps_avx(auVar100,auVar97);
          uVar157 = vcmpps_avx512vl(auVar103,auVar98,2);
          bVar86 = bVar86 & (byte)uVar157;
          if (bVar86 != 0) {
            auVar71._4_4_ = auVar105._4_4_ * auVar102._4_4_;
            auVar71._0_4_ = auVar105._0_4_ * auVar102._0_4_;
            auVar71._8_4_ = auVar105._8_4_ * auVar102._8_4_;
            auVar71._12_4_ = auVar105._12_4_ * auVar102._12_4_;
            auVar71._16_4_ = auVar105._16_4_ * auVar102._16_4_;
            auVar71._20_4_ = auVar105._20_4_ * auVar102._20_4_;
            auVar71._24_4_ = auVar105._24_4_ * auVar102._24_4_;
            auVar71._28_4_ = auVar103._28_4_;
            auVar7 = vfmsub231ps_fma(auVar71,auVar104,auVar111);
            auVar72._4_4_ = auVar111._4_4_ * auVar110._4_4_;
            auVar72._0_4_ = auVar111._0_4_ * auVar110._0_4_;
            auVar72._8_4_ = auVar111._8_4_ * auVar110._8_4_;
            auVar72._12_4_ = auVar111._12_4_ * auVar110._12_4_;
            auVar72._16_4_ = auVar111._16_4_ * auVar110._16_4_;
            auVar72._20_4_ = auVar111._20_4_ * auVar110._20_4_;
            auVar72._24_4_ = auVar111._24_4_ * auVar110._24_4_;
            auVar72._28_4_ = auVar111._28_4_;
            auVar95 = vfmsub231ps_fma(auVar72,auVar106,auVar105);
            auVar73._4_4_ = auVar104._4_4_ * auVar106._4_4_;
            auVar73._0_4_ = auVar104._0_4_ * auVar106._0_4_;
            auVar73._8_4_ = auVar104._8_4_ * auVar106._8_4_;
            auVar73._12_4_ = auVar104._12_4_ * auVar106._12_4_;
            auVar73._16_4_ = auVar104._16_4_ * auVar106._16_4_;
            auVar73._20_4_ = auVar104._20_4_ * auVar106._20_4_;
            auVar73._24_4_ = auVar104._24_4_ * auVar106._24_4_;
            auVar73._28_4_ = auVar104._28_4_;
            auVar8 = vfmsub231ps_fma(auVar73,auVar110,auVar102);
            auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar8));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar7),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar103 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = 0x3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            auVar37._16_4_ = 0x3f800000;
            auVar37._20_4_ = 0x3f800000;
            auVar37._24_4_ = 0x3f800000;
            auVar37._28_4_ = 0x3f800000;
            auVar102 = vfnmadd213ps_avx512vl(auVar103,ZEXT1632(auVar90),auVar37);
            auVar91 = vfmadd132ps_fma(auVar102,auVar103,auVar103);
            auVar197 = ZEXT1664(auVar91);
            auVar74._4_4_ = auVar8._4_4_ * auVar128._4_4_;
            auVar74._0_4_ = auVar8._0_4_ * auVar128._0_4_;
            auVar74._8_4_ = auVar8._8_4_ * auVar128._8_4_;
            auVar74._12_4_ = auVar8._12_4_ * auVar128._12_4_;
            auVar74._16_4_ = fVar164 * 0.0;
            auVar74._20_4_ = fVar144 * 0.0;
            auVar74._24_4_ = fVar154 * 0.0;
            auVar74._28_4_ = iVar1;
            auVar95 = vfmadd231ps_fma(auVar74,auVar107,ZEXT1632(auVar95));
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar109,ZEXT1632(auVar7));
            fVar144 = auVar91._0_4_;
            fVar154 = auVar91._4_4_;
            fVar155 = auVar91._8_4_;
            fVar156 = auVar91._12_4_;
            local_280._28_4_ = auVar103._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar95._12_4_ * fVar156,
                                    CONCAT48(auVar95._8_4_ * fVar155,
                                             CONCAT44(auVar95._4_4_ * fVar154,
                                                      auVar95._0_4_ * fVar144))));
            auVar202 = ZEXT3264(local_280);
            uVar157 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar164 = (ray->super_RayK<1>).tfar;
            auVar38._4_4_ = fVar164;
            auVar38._0_4_ = fVar164;
            auVar38._8_4_ = fVar164;
            auVar38._12_4_ = fVar164;
            auVar38._16_4_ = fVar164;
            auVar38._20_4_ = fVar164;
            auVar38._24_4_ = fVar164;
            auVar38._28_4_ = fVar164;
            uVar25 = vcmpps_avx512vl(local_280,auVar38,2);
            bVar86 = (byte)uVar157 & (byte)uVar25 & bVar86;
            if (bVar86 != 0) {
              uVar87 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar87 = bVar86 & uVar87;
              if ((char)uVar87 != '\0') {
                fVar164 = auVar100._0_4_ * fVar144;
                fVar177 = auVar100._4_4_ * fVar154;
                auVar75._4_4_ = fVar177;
                auVar75._0_4_ = fVar164;
                fVar88 = auVar100._8_4_ * fVar155;
                auVar75._8_4_ = fVar88;
                fVar89 = auVar100._12_4_ * fVar156;
                auVar75._12_4_ = fVar89;
                fVar163 = auVar100._16_4_ * 0.0;
                auVar75._16_4_ = fVar163;
                fVar178 = auVar100._20_4_ * 0.0;
                auVar75._20_4_ = fVar178;
                fVar137 = auVar100._24_4_ * 0.0;
                auVar75._24_4_ = fVar137;
                auVar75._28_4_ = auVar100._28_4_;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar176,auVar75);
                local_2c0._0_4_ =
                     (float)((uint)(bVar76 & 1) * (int)fVar164 |
                            (uint)!(bool)(bVar76 & 1) * auVar103._0_4_);
                bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar103._4_4_);
                bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar18 * (int)fVar88 | (uint)!bVar18 * auVar103._8_4_);
                bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar18 * (int)fVar89 | (uint)!bVar18 * auVar103._12_4_);
                bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar103._16_4_);
                bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar18 * (int)fVar178 | (uint)!bVar18 * auVar103._20_4_);
                bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar18 * (int)fVar137 | (uint)!bVar18 * auVar103._24_4_);
                bVar18 = SUB81(uVar77 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar103._28_4_);
                auVar103 = vsubps_avx(auVar96,auVar101);
                auVar91 = vfmadd213ps_fma(auVar103,local_2c0,auVar101);
                fVar164 = local_518->depth_scale;
                auVar39._4_4_ = fVar164;
                auVar39._0_4_ = fVar164;
                auVar39._8_4_ = fVar164;
                auVar39._12_4_ = fVar164;
                auVar39._16_4_ = fVar164;
                auVar39._20_4_ = fVar164;
                auVar39._24_4_ = fVar164;
                auVar39._28_4_ = fVar164;
                auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                              CONCAT48(auVar91._8_4_ + auVar91._8_4_
                                                                       ,CONCAT44(auVar91._4_4_ +
                                                                                 auVar91._4_4_,
                                                                                 auVar91._0_4_ +
                                                                                 auVar91._0_4_)))),
                                           auVar39);
                uVar24 = vcmpps_avx512vl(local_280,auVar103,6);
                uVar87 = uVar87 & uVar24;
                bVar86 = (byte)uVar87;
                if (bVar86 != 0) {
                  auVar162._0_4_ = auVar97._0_4_ * fVar144;
                  auVar162._4_4_ = auVar97._4_4_ * fVar154;
                  auVar162._8_4_ = auVar97._8_4_ * fVar155;
                  auVar162._12_4_ = auVar97._12_4_ * fVar156;
                  auVar162._16_4_ = auVar97._16_4_ * 0.0;
                  auVar162._20_4_ = auVar97._20_4_ * 0.0;
                  auVar162._24_4_ = auVar97._24_4_ * 0.0;
                  auVar162._28_4_ = 0;
                  auVar182._8_4_ = 0x3f800000;
                  auVar182._0_8_ = 0x3f8000003f800000;
                  auVar182._12_4_ = 0x3f800000;
                  auVar182._16_4_ = 0x3f800000;
                  auVar182._20_4_ = 0x3f800000;
                  auVar182._24_4_ = 0x3f800000;
                  auVar182._28_4_ = 0x3f800000;
                  auVar103 = vsubps_avx(auVar182,auVar162);
                  auVar133._0_4_ =
                       (uint)(bVar76 & 1) * (int)auVar162._0_4_ |
                       (uint)!(bool)(bVar76 & 1) * auVar103._0_4_;
                  bVar18 = (bool)((byte)(uVar77 >> 1) & 1);
                  auVar133._4_4_ =
                       (uint)bVar18 * (int)auVar162._4_4_ | (uint)!bVar18 * auVar103._4_4_;
                  bVar18 = (bool)((byte)(uVar77 >> 2) & 1);
                  auVar133._8_4_ =
                       (uint)bVar18 * (int)auVar162._8_4_ | (uint)!bVar18 * auVar103._8_4_;
                  bVar18 = (bool)((byte)(uVar77 >> 3) & 1);
                  auVar133._12_4_ =
                       (uint)bVar18 * (int)auVar162._12_4_ | (uint)!bVar18 * auVar103._12_4_;
                  bVar18 = (bool)((byte)(uVar77 >> 4) & 1);
                  auVar133._16_4_ =
                       (uint)bVar18 * (int)auVar162._16_4_ | (uint)!bVar18 * auVar103._16_4_;
                  bVar18 = (bool)((byte)(uVar77 >> 5) & 1);
                  auVar133._20_4_ =
                       (uint)bVar18 * (int)auVar162._20_4_ | (uint)!bVar18 * auVar103._20_4_;
                  bVar18 = (bool)((byte)(uVar77 >> 6) & 1);
                  auVar133._24_4_ =
                       (uint)bVar18 * (int)auVar162._24_4_ | (uint)!bVar18 * auVar103._24_4_;
                  auVar133._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar103._28_4_;
                  auVar40._8_4_ = 0x40000000;
                  auVar40._0_8_ = 0x4000000040000000;
                  auVar40._12_4_ = 0x40000000;
                  auVar40._16_4_ = 0x40000000;
                  auVar40._20_4_ = 0x40000000;
                  auVar40._24_4_ = 0x40000000;
                  auVar40._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar133,auVar182,auVar40);
                  local_260 = (int)lVar83;
                  local_25c = iVar14;
                  local_250 = local_4b0._0_8_;
                  uStack_248 = local_4b0._8_8_;
                  local_240 = local_4c0._0_8_;
                  uStack_238 = local_4c0._8_8_;
                  local_230 = local_4d0._0_8_;
                  uStack_228 = local_4d0._8_8_;
                  local_220 = local_4e0;
                  uStack_218 = uStack_4d8;
                  pGVar81 = (context->scene->geometries).items[local_530].ptr;
                  if ((pGVar81->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar84 = (uint)uVar87;
                    auVar91 = vcvtsi2ss_avx512f(auVar92,(int)lVar83);
                    fVar164 = auVar91._0_4_;
                    local_200[0] = (fVar164 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar164 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar164 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar164 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar164 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar164 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar164 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar164 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar151._8_4_ = 0x7f800000;
                    auVar151._0_8_ = 0x7f8000007f800000;
                    auVar151._12_4_ = 0x7f800000;
                    auVar151._16_4_ = 0x7f800000;
                    auVar151._20_4_ = 0x7f800000;
                    auVar151._24_4_ = 0x7f800000;
                    auVar151._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar151,local_280);
                    auVar134._0_4_ =
                         (uint)(bVar86 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar134._4_4_ = (uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar134._8_4_ = (uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar134._12_4_ = (uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar134._16_4_ = (uint)bVar18 * auVar103._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar134._20_4_ = (uint)bVar18 * auVar103._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar134._24_4_ = (uint)bVar18 * auVar103._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar87 >> 7,0);
                    auVar134._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar103 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar103 = vminps_avx(auVar134,auVar103);
                    auVar102 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar102);
                    auVar102 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar102);
                    uVar157 = vcmpps_avx512vl(auVar134,auVar103,0);
                    if (((byte)uVar157 & bVar86) != 0) {
                      uVar84 = (uint)((byte)uVar157 & bVar86);
                    }
                    uVar79 = 0;
                    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                      uVar79 = uVar79 + 1;
                    }
                    uVar77 = (ulong)uVar79;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_280;
                      local_468 = pGVar81;
                      do {
                        local_494 = local_200[uVar77];
                        local_490 = *(undefined4 *)(local_1e0 + uVar77 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar77 * 4);
                        local_510.context = context->user;
                        fVar164 = 1.0 - local_494;
                        auVar30._8_4_ = 0x80000000;
                        auVar30._0_8_ = 0x8000000080000000;
                        auVar30._12_4_ = 0x80000000;
                        auVar95 = vxorps_avx512vl(ZEXT416((uint)fVar164),auVar30);
                        auVar91 = ZEXT416((uint)(local_494 * fVar164 * 4.0));
                        auVar90 = vfnmsub213ss_fma(ZEXT416((uint)local_494),ZEXT416((uint)local_494)
                                                   ,auVar91);
                        auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),
                                                  auVar91);
                        fVar164 = fVar164 * auVar95._0_4_ * 0.5;
                        fVar144 = auVar90._0_4_ * 0.5;
                        auVar197 = ZEXT464((uint)fVar144);
                        fVar154 = auVar91._0_4_ * 0.5;
                        fVar155 = local_494 * local_494 * 0.5;
                        auVar187._0_4_ = fVar155 * (float)local_4e0._0_4_;
                        auVar187._4_4_ = fVar155 * (float)local_4e0._4_4_;
                        auVar187._8_4_ = fVar155 * (float)uStack_4d8;
                        auVar187._12_4_ = fVar155 * uStack_4d8._4_4_;
                        auVar169._4_4_ = fVar154;
                        auVar169._0_4_ = fVar154;
                        auVar169._8_4_ = fVar154;
                        auVar169._12_4_ = fVar154;
                        auVar91 = vfmadd132ps_fma(auVar169,auVar187,local_4d0);
                        auVar188._4_4_ = fVar144;
                        auVar188._0_4_ = fVar144;
                        auVar188._8_4_ = fVar144;
                        auVar188._12_4_ = fVar144;
                        auVar91 = vfmadd132ps_fma(auVar188,auVar91,local_4c0);
                        auVar195 = ZEXT1664(auVar91);
                        auVar170._4_4_ = fVar164;
                        auVar170._0_4_ = fVar164;
                        auVar170._8_4_ = fVar164;
                        auVar170._12_4_ = fVar164;
                        auVar90 = vfmadd132ps_fma(auVar170,auVar91,local_4b0);
                        local_4a0 = vmovlps_avx(auVar90);
                        local_498 = vextractps_avx(auVar90,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_530;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_53c = -1;
                        local_510.valid = &local_53c;
                        local_510.geometryUserPtr = pGVar81->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01e0b05b:
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar81->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar195 = ZEXT1664(auVar195._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            (*p_Var17)(&local_510);
                            auVar202 = ZEXT3264(local_460);
                            context = local_538;
                            pGVar81 = local_468;
                            if (*local_510.valid == 0) goto LAB_01e0b0fd;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar195 = ZEXT1664(auVar91);
                          auVar197 = ZEXT464((uint)fVar144);
                          (*pGVar81->intersectionFilterN)(&local_510);
                          auVar202 = ZEXT3264(local_460);
                          context = local_538;
                          pGVar81 = local_468;
                          if (*local_510.valid != 0) goto LAB_01e0b05b;
LAB_01e0b0fd:
                          (ray->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_538;
                          pGVar81 = local_468;
                        }
                        bVar86 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar87;
                        fVar164 = (ray->super_RayK<1>).tfar;
                        auVar41._4_4_ = fVar164;
                        auVar41._0_4_ = fVar164;
                        auVar41._8_4_ = fVar164;
                        auVar41._12_4_ = fVar164;
                        auVar41._16_4_ = fVar164;
                        auVar41._20_4_ = fVar164;
                        auVar41._24_4_ = fVar164;
                        auVar41._28_4_ = fVar164;
                        uVar157 = vcmpps_avx512vl(auVar202._0_32_,auVar41,2);
                        if ((bVar86 & (byte)uVar157) == 0) goto LAB_01e0b1a0;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar86 = bVar86 & (byte)uVar157;
                        uVar84 = (uint)bVar86;
                        uVar87 = (ulong)uVar84;
                        auVar152._8_4_ = 0x7f800000;
                        auVar152._0_8_ = 0x7f8000007f800000;
                        auVar152._12_4_ = 0x7f800000;
                        auVar152._16_4_ = 0x7f800000;
                        auVar152._20_4_ = 0x7f800000;
                        auVar152._24_4_ = 0x7f800000;
                        auVar152._28_4_ = 0x7f800000;
                        auVar103 = vblendmps_avx512vl(auVar152,auVar202._0_32_);
                        auVar135._0_4_ =
                             (uint)(bVar86 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 1 & 1);
                        auVar135._4_4_ = (uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 2 & 1);
                        auVar135._8_4_ = (uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 3 & 1);
                        auVar135._12_4_ =
                             (uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 4 & 1);
                        auVar135._16_4_ =
                             (uint)bVar18 * auVar103._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 5 & 1);
                        auVar135._20_4_ =
                             (uint)bVar18 * auVar103._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 6 & 1);
                        auVar135._24_4_ =
                             (uint)bVar18 * auVar103._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar135._28_4_ =
                             (uint)(bVar86 >> 7) * auVar103._28_4_ |
                             (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                        auVar103 = vshufps_avx(auVar135,auVar135,0xb1);
                        auVar103 = vminps_avx(auVar135,auVar103);
                        auVar102 = vshufpd_avx(auVar103,auVar103,5);
                        auVar103 = vminps_avx(auVar103,auVar102);
                        auVar102 = vpermpd_avx2(auVar103,0x4e);
                        auVar103 = vminps_avx(auVar103,auVar102);
                        uVar157 = vcmpps_avx512vl(auVar135,auVar103,0);
                        bVar86 = (byte)uVar157 & bVar86;
                        if (bVar86 != 0) {
                          uVar84 = (uint)bVar86;
                        }
                        uVar79 = 0;
                        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                          uVar79 = uVar79 + 1;
                        }
                        uVar77 = (ulong)uVar79;
                      } while( true );
                    }
                    fVar164 = local_200[uVar77];
                    fVar144 = *(float *)(local_1e0 + uVar77 * 4);
                    fVar154 = 1.0 - fVar164;
                    auVar29._8_4_ = 0x80000000;
                    auVar29._0_8_ = 0x8000000080000000;
                    auVar29._12_4_ = 0x80000000;
                    auVar95 = vxorps_avx512vl(ZEXT416((uint)fVar154),auVar29);
                    auVar91 = ZEXT416((uint)(fVar164 * fVar154 * 4.0));
                    auVar90 = vfnmsub213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),auVar91
                                              );
                    auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),auVar91)
                    ;
                    fVar154 = fVar154 * auVar95._0_4_ * 0.5;
                    fVar155 = auVar90._0_4_ * 0.5;
                    auVar197 = ZEXT464((uint)fVar155);
                    fVar156 = auVar91._0_4_ * 0.5;
                    fVar177 = fVar164 * fVar164 * 0.5;
                    auVar185._0_4_ = fVar177 * (float)local_4e0._0_4_;
                    auVar185._4_4_ = fVar177 * (float)local_4e0._4_4_;
                    auVar185._8_4_ = fVar177 * (float)uStack_4d8;
                    auVar185._12_4_ = fVar177 * uStack_4d8._4_4_;
                    auVar167._4_4_ = fVar156;
                    auVar167._0_4_ = fVar156;
                    auVar167._8_4_ = fVar156;
                    auVar167._12_4_ = fVar156;
                    auVar91 = vfmadd132ps_fma(auVar167,auVar185,local_4d0);
                    auVar186._4_4_ = fVar155;
                    auVar186._0_4_ = fVar155;
                    auVar186._8_4_ = fVar155;
                    auVar186._12_4_ = fVar155;
                    auVar91 = vfmadd132ps_fma(auVar186,auVar91,local_4c0);
                    auVar195 = ZEXT1664(auVar91);
                    auVar168._4_4_ = fVar154;
                    auVar168._0_4_ = fVar154;
                    auVar168._8_4_ = fVar154;
                    auVar168._12_4_ = fVar154;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar77 * 4);
                    auVar91 = vfmadd132ps_fma(auVar168,auVar91,local_4b0);
                    uVar157 = vmovlps_avx(auVar91);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar157;
                    fVar154 = (float)vextractps_avx(auVar91,2);
                    (ray->Ng).field_0.field_0.z = fVar154;
                    ray->u = fVar164;
                    ray->v = fVar144;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_530;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01e0aeb0;
      }
LAB_01e0a57d:
      fVar164 = (ray->super_RayK<1>).tfar;
      auVar36._4_4_ = fVar164;
      auVar36._0_4_ = fVar164;
      auVar36._8_4_ = fVar164;
      auVar36._12_4_ = fVar164;
      auVar36._16_4_ = fVar164;
      auVar36._20_4_ = fVar164;
      auVar36._24_4_ = fVar164;
      auVar36._28_4_ = fVar164;
      uVar157 = vcmpps_avx512vl(local_80,auVar36,2);
      uVar84 = (uint)uVar80 & (uint)uVar80 + 0xff & (uint)uVar157;
      uVar80 = (ulong)uVar84;
    } while (uVar84 != 0);
  }
  return;
LAB_01e0b1a0:
  auVar103 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar218 = ZEXT3264(auVar103);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar216 = ZEXT3264(auVar103);
  auVar217 = ZEXT464(0xbf800000);
  prim = local_520;
LAB_01e0aeb0:
  lVar83 = lVar83 + 8;
  if (iVar14 <= (int)lVar83) goto LAB_01e0a57d;
  goto LAB_01e0a612;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }